

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  byte bVar59;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong uVar60;
  byte bVar61;
  ulong uVar62;
  Primitive *pPVar63;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined8 in_R11;
  byte bVar64;
  int iVar65;
  byte bVar66;
  bool bVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar130;
  uint uVar131;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar132;
  uint uVar136;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float pp;
  float fVar137;
  float fVar138;
  float fVar153;
  float fVar154;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar170 [16];
  undefined1 auVar174 [32];
  float fVar175;
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar206 [32];
  undefined1 auVar210 [16];
  float fVar217;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar221;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  float fVar227;
  undefined1 auVar228 [32];
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar229 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [28];
  float fVar236;
  undefined1 auVar237 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  undefined1 local_8a0 [16];
  uint local_890;
  uint local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  Primitive *local_798;
  Primitive *local_790;
  ulong local_788;
  ulong local_780;
  ulong local_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCHitN local_520 [16];
  undefined1 auStack_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  uint local_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar243 [64];
  
  uVar68 = (ulong)(byte)prim[1];
  pPVar63 = prim + uVar68 * 0x19 + 0x16;
  fVar227 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar76 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar77 = vsubps_avx(auVar72,*(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  fVar199 = fVar227 * auVar77._0_4_;
  fVar137 = fVar227 * auVar76._0_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar68 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar68 * 5 + 6);
  auVar85 = vpmovsxbd_avx2(auVar73);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar80);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar74);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar68 * 0xc + 6);
  auVar90 = vpmovsxbd_avx2(auVar70);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar87 = vpmovsxbd_avx2(auVar79);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar91 = vpmovsxbd_avx2(auVar78);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar68 * 0x13 + 6);
  auVar94 = vpmovsxbd_avx2(auVar71);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar92 = vcvtdq2ps_avx(auVar94);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar68 * 0x14 + 6);
  auVar83 = vpmovsxbd_avx2(auVar75);
  auVar93 = vcvtdq2ps_avx(auVar83);
  auVar102._4_4_ = fVar137;
  auVar102._0_4_ = fVar137;
  auVar102._8_4_ = fVar137;
  auVar102._12_4_ = fVar137;
  auVar102._16_4_ = fVar137;
  auVar102._20_4_ = fVar137;
  auVar102._24_4_ = fVar137;
  auVar102._28_4_ = fVar137;
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar95 = ZEXT1632(CONCAT412(fVar227 * auVar76._12_4_,
                               CONCAT48(fVar227 * auVar76._8_4_,
                                        CONCAT44(fVar227 * auVar76._4_4_,fVar137))));
  auVar84 = vpermps_avx2(auVar104,auVar95);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar82 = vpermps_avx512vl(auVar81,auVar95);
  fVar137 = auVar82._0_4_;
  fVar230 = auVar82._4_4_;
  auVar95._4_4_ = fVar230 * auVar86._4_4_;
  auVar95._0_4_ = fVar137 * auVar86._0_4_;
  fVar231 = auVar82._8_4_;
  auVar95._8_4_ = fVar231 * auVar86._8_4_;
  fVar232 = auVar82._12_4_;
  auVar95._12_4_ = fVar232 * auVar86._12_4_;
  fVar207 = auVar82._16_4_;
  auVar95._16_4_ = fVar207 * auVar86._16_4_;
  fVar208 = auVar82._20_4_;
  auVar95._20_4_ = fVar208 * auVar86._20_4_;
  fVar209 = auVar82._24_4_;
  auVar95._24_4_ = fVar209 * auVar86._24_4_;
  auVar95._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar87._4_4_ * fVar230;
  auVar94._0_4_ = auVar87._0_4_ * fVar137;
  auVar94._8_4_ = auVar87._8_4_ * fVar231;
  auVar94._12_4_ = auVar87._12_4_ * fVar232;
  auVar94._16_4_ = auVar87._16_4_ * fVar207;
  auVar94._20_4_ = auVar87._20_4_ * fVar208;
  auVar94._24_4_ = auVar87._24_4_ * fVar209;
  auVar94._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar93._4_4_ * fVar230;
  auVar83._0_4_ = auVar93._0_4_ * fVar137;
  auVar83._8_4_ = auVar93._8_4_ * fVar231;
  auVar83._12_4_ = auVar93._12_4_ * fVar232;
  auVar83._16_4_ = auVar93._16_4_ * fVar207;
  auVar83._20_4_ = auVar93._20_4_ * fVar208;
  auVar83._24_4_ = auVar93._24_4_ * fVar209;
  auVar83._28_4_ = auVar82._28_4_;
  auVar72 = vfmadd231ps_fma(auVar95,auVar84,auVar85);
  auVar73 = vfmadd231ps_fma(auVar94,auVar84,auVar90);
  auVar80 = vfmadd231ps_fma(auVar83,auVar92,auVar84);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar102,auVar88);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar102,auVar89);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar91,auVar102);
  auVar103._4_4_ = fVar199;
  auVar103._0_4_ = fVar199;
  auVar103._8_4_ = fVar199;
  auVar103._12_4_ = fVar199;
  auVar103._16_4_ = fVar199;
  auVar103._20_4_ = fVar199;
  auVar103._24_4_ = fVar199;
  auVar103._28_4_ = fVar199;
  auVar83 = ZEXT1632(CONCAT412(fVar227 * auVar77._12_4_,
                               CONCAT48(fVar227 * auVar77._8_4_,
                                        CONCAT44(fVar227 * auVar77._4_4_,fVar199))));
  auVar94 = vpermps_avx2(auVar104,auVar83);
  auVar83 = vpermps_avx512vl(auVar81,auVar83);
  auVar84 = vmulps_avx512vl(auVar83,auVar86);
  auVar97._0_4_ = auVar83._0_4_ * auVar87._0_4_;
  auVar97._4_4_ = auVar83._4_4_ * auVar87._4_4_;
  auVar97._8_4_ = auVar83._8_4_ * auVar87._8_4_;
  auVar97._12_4_ = auVar83._12_4_ * auVar87._12_4_;
  auVar97._16_4_ = auVar83._16_4_ * auVar87._16_4_;
  auVar97._20_4_ = auVar83._20_4_ * auVar87._20_4_;
  auVar97._24_4_ = auVar83._24_4_ * auVar87._24_4_;
  auVar97._28_4_ = 0;
  auVar87._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar87._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar87._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar87._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar87._16_4_ = auVar83._16_4_ * auVar93._16_4_;
  auVar87._20_4_ = auVar83._20_4_ * auVar93._20_4_;
  auVar87._24_4_ = auVar83._24_4_ * auVar93._24_4_;
  auVar87._28_4_ = auVar86._28_4_;
  auVar85 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar85);
  auVar74 = vfmadd231ps_fma(auVar97,auVar94,auVar90);
  auVar70 = vfmadd231ps_fma(auVar87,auVar94,auVar92);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar103,auVar88);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar89);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar103,auVar91);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar88 = vandps_avx(ZEXT1632(auVar72),auVar99);
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar88,auVar101,1);
  bVar67 = (bool)((byte)uVar60 & 1);
  auVar84._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._0_4_;
  bVar67 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._4_4_;
  bVar67 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._8_4_;
  bVar67 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar73),auVar99);
  uVar60 = vcmpps_avx512vl(auVar88,auVar101,1);
  bVar67 = (bool)((byte)uVar60 & 1);
  auVar81._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar73._0_4_;
  bVar67 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar73._4_4_;
  bVar67 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar73._8_4_;
  bVar67 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar73._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar80),auVar99);
  uVar60 = vcmpps_avx512vl(auVar88,auVar101,1);
  bVar67 = (bool)((byte)uVar60 & 1);
  auVar88._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._0_4_;
  bVar67 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._4_4_;
  bVar67 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._8_4_;
  bVar67 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar86 = vrcp14ps_avx512vl(auVar84);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar72 = vfnmadd213ps_fma(auVar84,auVar86,auVar100);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar81);
  auVar73 = vfnmadd213ps_fma(auVar81,auVar86,auVar100);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar88);
  auVar80 = vfnmadd213ps_fma(auVar88,auVar86,auVar100);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 7 + 6));
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar86,auVar86);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar86 = vsubps_avx512vl(auVar88,auVar85);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 9 + 6));
  auVar91._4_4_ = auVar72._4_4_ * auVar86._4_4_;
  auVar91._0_4_ = auVar72._0_4_ * auVar86._0_4_;
  auVar91._8_4_ = auVar72._8_4_ * auVar86._8_4_;
  auVar91._12_4_ = auVar72._12_4_ * auVar86._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * 0.0;
  auVar91._20_4_ = auVar86._20_4_ * 0.0;
  auVar91._24_4_ = auVar86._24_4_ * 0.0;
  auVar91._28_4_ = auVar86._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar85 = vsubps_avx512vl(auVar88,auVar85);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0xe + 6));
  auVar98._0_4_ = auVar72._0_4_ * auVar85._0_4_;
  auVar98._4_4_ = auVar72._4_4_ * auVar85._4_4_;
  auVar98._8_4_ = auVar72._8_4_ * auVar85._8_4_;
  auVar98._12_4_ = auVar72._12_4_ * auVar85._12_4_;
  auVar98._16_4_ = auVar85._16_4_ * 0.0;
  auVar98._20_4_ = auVar85._20_4_ * 0.0;
  auVar98._24_4_ = auVar85._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar74));
  auVar92._4_4_ = auVar73._4_4_ * auVar88._4_4_;
  auVar92._0_4_ = auVar73._0_4_ * auVar88._0_4_;
  auVar92._8_4_ = auVar73._8_4_ * auVar88._8_4_;
  auVar92._12_4_ = auVar73._12_4_ * auVar88._12_4_;
  auVar92._16_4_ = auVar88._16_4_ * 0.0;
  auVar92._20_4_ = auVar88._20_4_ * 0.0;
  auVar92._24_4_ = auVar88._24_4_ * 0.0;
  auVar92._28_4_ = auVar88._28_4_;
  auVar87 = vpbroadcastd_avx512vl();
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar74));
  auVar96._0_4_ = auVar73._0_4_ * auVar88._0_4_;
  auVar96._4_4_ = auVar73._4_4_ * auVar88._4_4_;
  auVar96._8_4_ = auVar73._8_4_ * auVar88._8_4_;
  auVar96._12_4_ = auVar73._12_4_ * auVar88._12_4_;
  auVar96._16_4_ = auVar88._16_4_ * 0.0;
  auVar96._20_4_ = auVar88._20_4_ * 0.0;
  auVar96._24_4_ = auVar88._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x15 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar70));
  auVar93._4_4_ = auVar88._4_4_ * auVar80._4_4_;
  auVar93._0_4_ = auVar88._0_4_ * auVar80._0_4_;
  auVar93._8_4_ = auVar88._8_4_ * auVar80._8_4_;
  auVar93._12_4_ = auVar88._12_4_ * auVar80._12_4_;
  auVar93._16_4_ = auVar88._16_4_ * 0.0;
  auVar93._20_4_ = auVar88._20_4_ * 0.0;
  auVar93._24_4_ = auVar88._24_4_ * 0.0;
  auVar93._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar70));
  auVar82._0_4_ = auVar80._0_4_ * auVar88._0_4_;
  auVar82._4_4_ = auVar80._4_4_ * auVar88._4_4_;
  auVar82._8_4_ = auVar80._8_4_ * auVar88._8_4_;
  auVar82._12_4_ = auVar80._12_4_ * auVar88._12_4_;
  auVar82._16_4_ = auVar88._16_4_ * 0.0;
  auVar82._20_4_ = auVar88._20_4_ * 0.0;
  auVar82._24_4_ = auVar88._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar88 = vpminsd_avx2(auVar91,auVar98);
  auVar85 = vpminsd_avx2(auVar92,auVar96);
  auVar88 = vmaxps_avx(auVar88,auVar85);
  auVar85 = vpminsd_avx2(auVar93,auVar82);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar86._4_4_ = uVar159;
  auVar86._0_4_ = uVar159;
  auVar86._8_4_ = uVar159;
  auVar86._12_4_ = uVar159;
  auVar86._16_4_ = uVar159;
  auVar86._20_4_ = uVar159;
  auVar86._24_4_ = uVar159;
  auVar86._28_4_ = uVar159;
  auVar85 = vmaxps_avx512vl(auVar85,auVar86);
  auVar88 = vmaxps_avx(auVar88,auVar85);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  auVar85._16_4_ = 0x3f7ffffa;
  auVar85._20_4_ = 0x3f7ffffa;
  auVar85._24_4_ = 0x3f7ffffa;
  auVar85._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar88,auVar85);
  auVar88 = vpmaxsd_avx2(auVar91,auVar98);
  auVar85 = vpmaxsd_avx2(auVar92,auVar96);
  auVar88 = vminps_avx(auVar88,auVar85);
  auVar85 = vpmaxsd_avx2(auVar93,auVar82);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar89._4_4_ = uVar159;
  auVar89._0_4_ = uVar159;
  auVar89._8_4_ = uVar159;
  auVar89._12_4_ = uVar159;
  auVar89._16_4_ = uVar159;
  auVar89._20_4_ = uVar159;
  auVar89._24_4_ = uVar159;
  auVar89._28_4_ = uVar159;
  auVar85 = vminps_avx512vl(auVar85,auVar89);
  auVar88 = vminps_avx(auVar88,auVar85);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar90);
  uVar12 = vcmpps_avx512vl(local_300,auVar88,2);
  uVar14 = vpcmpgtd_avx512vl(auVar87,_DAT_01fb4ba0);
  local_780 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar14));
  local_550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_798 = pPVar63;
  local_790 = prim;
LAB_019d60fd:
  iVar65 = 1;
  if (local_780 == 0) {
LAB_019d8a66:
    return local_780 != 0;
  }
  iVar15 = 0;
  for (uVar60 = local_780; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    iVar15 = iVar15 + 1;
  }
  local_788 = local_780 - 1 & local_780;
  uVar60 = (ulong)(uint)(iVar15 << 6);
  auVar72 = *(undefined1 (*) [16])(pPVar63 + uVar60);
  if (local_788 != 0) {
    uVar62 = local_788 - 1 & local_788;
    for (uVar68 = local_788; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar62 != 0) {
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar73 = *(undefined1 (*) [16])(pPVar63 + uVar60 + 0x10);
  auVar80 = *(undefined1 (*) [16])(pPVar63 + uVar60 + 0x20);
  auVar74 = *(undefined1 (*) [16])(pPVar63 + uVar60 + 0x30);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar79 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar238._4_4_ = uVar159;
  auVar238._0_4_ = uVar159;
  auVar238._8_4_ = uVar159;
  auVar238._12_4_ = uVar159;
  local_440._16_4_ = uVar159;
  local_440._0_16_ = auVar238;
  local_440._20_4_ = uVar159;
  local_440._24_4_ = uVar159;
  local_440._28_4_ = uVar159;
  auVar243 = ZEXT3264(local_440);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar244._4_4_ = uVar159;
  auVar244._0_4_ = uVar159;
  auVar244._8_4_ = uVar159;
  auVar244._12_4_ = uVar159;
  local_460._16_4_ = uVar159;
  local_460._0_16_ = auVar244;
  local_460._20_4_ = uVar159;
  local_460._24_4_ = uVar159;
  local_460._28_4_ = uVar159;
  auVar70 = vunpcklps_avx(auVar238,auVar244);
  fVar227 = *(float *)(ray + k * 4 + 0x60);
  auVar245._4_4_ = fVar227;
  auVar245._0_4_ = fVar227;
  auVar245._8_4_ = fVar227;
  auVar245._12_4_ = fVar227;
  local_480._16_4_ = fVar227;
  local_480._0_16_ = auVar245;
  local_480._20_4_ = fVar227;
  local_480._24_4_ = fVar227;
  local_480._28_4_ = fVar227;
  local_6f0 = vinsertps_avx(auVar70,auVar245,0x28);
  auVar233 = ZEXT1664(local_6f0);
  auVar77._0_4_ = auVar72._0_4_ + auVar73._0_4_ + auVar80._0_4_ + auVar74._0_4_;
  auVar77._4_4_ = auVar72._4_4_ + auVar73._4_4_ + auVar80._4_4_ + auVar74._4_4_;
  auVar77._8_4_ = auVar72._8_4_ + auVar73._8_4_ + auVar80._8_4_ + auVar74._8_4_;
  auVar77._12_4_ = auVar72._12_4_ + auVar73._12_4_ + auVar80._12_4_ + auVar74._12_4_;
  auVar76._8_4_ = 0x3e800000;
  auVar76._0_8_ = 0x3e8000003e800000;
  auVar76._12_4_ = 0x3e800000;
  auVar70 = vmulps_avx512vl(auVar77,auVar76);
  auVar70 = vsubps_avx(auVar70,auVar79);
  auVar70 = vdpps_avx(auVar70,local_6f0,0x7f);
  fVar137 = *(float *)(ray + k * 4 + 0x30);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  auVar237 = ZEXT1664(local_700);
  local_778 = (ulong)*(uint *)(prim + 2);
  auVar222._4_12_ = ZEXT812(0) << 0x20;
  auVar222._0_4_ = local_700._0_4_;
  auVar71 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar222);
  auVar78 = vfnmadd213ss_fma(auVar71,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar70._0_4_ * auVar71._0_4_ * auVar78._0_4_;
  auVar223._4_4_ = local_2e0;
  auVar223._0_4_ = local_2e0;
  auVar223._8_4_ = local_2e0;
  auVar223._12_4_ = local_2e0;
  fStack_3f0 = local_2e0;
  _local_400 = auVar223;
  fStack_3ec = local_2e0;
  fStack_3e8 = local_2e0;
  fStack_3e4 = local_2e0;
  auVar70 = vfmadd231ps_fma(auVar79,local_6f0,auVar223);
  auVar70 = vblendps_avx(auVar70,ZEXT816(0) << 0x40,8);
  auVar72 = vsubps_avx(auVar72,auVar70);
  auVar80 = vsubps_avx(auVar80,auVar70);
  auVar226 = ZEXT1664(auVar80);
  auVar73 = vsubps_avx(auVar73,auVar70);
  auVar229 = ZEXT1664(auVar73);
  auVar74 = vsubps_avx(auVar74,auVar70);
  auVar88 = vbroadcastss_avx512vl(auVar72);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_680 = ZEXT1632(auVar72);
  auVar85 = vpermps_avx512vl(auVar106,local_680);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar107,local_680);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  auVar89 = vpermps_avx512vl(auVar108,local_680);
  auVar90 = vbroadcastss_avx512vl(auVar73);
  local_6c0 = ZEXT1632(auVar73);
  auVar87 = vpermps_avx512vl(auVar106,local_6c0);
  auVar91 = vpermps_avx512vl(auVar107,local_6c0);
  auVar92 = vpermps_avx512vl(auVar108,local_6c0);
  local_840 = vbroadcastss_avx512vl(auVar80);
  auVar247 = ZEXT3264(local_840);
  local_6a0 = ZEXT1632(auVar80);
  local_860 = vpermps_avx512vl(auVar106,local_6a0);
  auVar248 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar107,local_6a0);
  auVar249 = ZEXT3264(local_880);
  auVar93 = vpermps_avx512vl(auVar108,local_6a0);
  local_260 = vbroadcastss_avx512vl(auVar74);
  _local_6e0 = ZEXT1632(auVar74);
  local_240 = vpermps_avx512vl(auVar106,_local_6e0);
  local_2a0 = vpermps_avx2(auVar107,_local_6e0);
  local_2c0 = vpermps_avx2(auVar108,_local_6e0);
  auVar72 = vfmadd231ps_fma(ZEXT432((uint)(fVar227 * fVar227)),local_460,local_460);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_440,local_440);
  local_220._0_4_ = auVar72._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar105);
  local_650 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar137 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_530 = vpbroadcastd_avx512vl();
  uVar60 = 0;
  bVar66 = 0;
  local_540 = vpbroadcastd_avx512vl();
  auVar72 = vsqrtss_avx(local_700,local_700);
  local_884 = auVar72._0_4_;
  auVar72 = vsqrtss_avx(local_700,local_700);
  local_888 = auVar72._0_4_;
  local_390 = ZEXT816(0x3f80000000000000);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar251 = ZEXT3264(auVar94);
  auVar220 = ZEXT3264(_DAT_01f7b040);
  local_280 = local_240;
  do {
    auVar72 = vmovshdup_avx(local_390);
    auVar72 = vsubps_avx(auVar72,local_390);
    auVar139._0_4_ = auVar72._0_4_;
    fVar11 = auVar139._0_4_ * 0.04761905;
    uVar159 = local_390._0_4_;
    auVar214._4_4_ = uVar159;
    auVar214._0_4_ = uVar159;
    auVar214._8_4_ = uVar159;
    auVar214._12_4_ = uVar159;
    auVar214._16_4_ = uVar159;
    auVar214._20_4_ = uVar159;
    auVar214._24_4_ = uVar159;
    auVar214._28_4_ = uVar159;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    local_720._16_4_ = auVar139._0_4_;
    local_720._0_16_ = auVar139;
    local_720._20_4_ = auVar139._0_4_;
    local_720._24_4_ = auVar139._0_4_;
    local_720._28_4_ = auVar139._0_4_;
    auVar72 = vfmadd231ps_fma(auVar214,local_720,auVar220._0_32_);
    auVar250 = auVar251._0_32_;
    auVar83 = vsubps_avx512vl(auVar250,ZEXT1632(auVar72));
    fVar227 = auVar83._0_4_;
    fVar231 = auVar83._4_4_;
    fVar207 = auVar83._8_4_;
    fVar209 = auVar83._12_4_;
    fVar217 = auVar83._16_4_;
    fVar176 = auVar83._20_4_;
    fVar10 = auVar83._24_4_;
    fVar138 = fVar227 * fVar227 * fVar227;
    fVar153 = fVar231 * fVar231 * fVar231;
    auVar113._4_4_ = fVar153;
    auVar113._0_4_ = fVar138;
    fVar154 = fVar207 * fVar207 * fVar207;
    auVar113._8_4_ = fVar154;
    fVar155 = fVar209 * fVar209 * fVar209;
    auVar113._12_4_ = fVar155;
    fVar156 = fVar217 * fVar217 * fVar217;
    auVar113._16_4_ = fVar156;
    fVar157 = fVar176 * fVar176 * fVar176;
    auVar113._20_4_ = fVar157;
    fVar158 = fVar10 * fVar10 * fVar10;
    auVar113._24_4_ = fVar158;
    auVar113._28_4_ = auVar139._0_4_;
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar94 = vmulps_avx512vl(auVar113,auVar82);
    fVar230 = auVar72._0_4_;
    fVar232 = auVar72._4_4_;
    fVar208 = auVar72._8_4_;
    fVar199 = auVar72._12_4_;
    fVar175 = fVar230 * fVar230 * fVar230;
    fVar196 = fVar232 * fVar232 * fVar232;
    fVar197 = fVar208 * fVar208 * fVar208;
    fVar198 = fVar199 * fVar199 * fVar199;
    auVar234._0_4_ = fVar230 * fVar227;
    auVar234._4_4_ = fVar232 * fVar231;
    auVar234._8_4_ = fVar208 * fVar207;
    auVar234._12_4_ = fVar199 * fVar209;
    auVar234._16_4_ = fVar217 * 0.0;
    auVar234._20_4_ = fVar176 * 0.0;
    auVar234._28_36_ = auVar233._28_36_;
    auVar234._24_4_ = fVar10 * 0.0;
    auVar84 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar198,CONCAT48(fVar197,CONCAT44(fVar196,fVar175))
                                                )),auVar82);
    fVar236 = auVar84._28_4_ + auVar139._0_4_;
    fVar29 = auVar237._28_4_;
    fVar221 = fVar236 + fVar29 + auVar220._28_4_;
    auVar114._4_4_ = fVar153 * 0.16666667;
    auVar114._0_4_ = fVar138 * 0.16666667;
    auVar114._8_4_ = fVar154 * 0.16666667;
    auVar114._12_4_ = fVar155 * 0.16666667;
    auVar114._16_4_ = fVar156 * 0.16666667;
    auVar114._20_4_ = fVar157 * 0.16666667;
    auVar114._24_4_ = fVar158 * 0.16666667;
    auVar114._28_4_ = fVar236;
    auVar115._4_4_ =
         (auVar234._4_4_ * fVar231 * 12.0 + auVar234._4_4_ * fVar232 * 6.0 + fVar196 + auVar94._4_4_
         ) * 0.16666667;
    auVar115._0_4_ =
         (auVar234._0_4_ * fVar227 * 12.0 + auVar234._0_4_ * fVar230 * 6.0 + fVar175 + auVar94._0_4_
         ) * 0.16666667;
    auVar115._8_4_ =
         (auVar234._8_4_ * fVar207 * 12.0 + auVar234._8_4_ * fVar208 * 6.0 + fVar197 + auVar94._8_4_
         ) * 0.16666667;
    auVar115._12_4_ =
         (auVar234._12_4_ * fVar209 * 12.0 + auVar234._12_4_ * fVar199 * 6.0 +
         fVar198 + auVar94._12_4_) * 0.16666667;
    auVar115._16_4_ =
         (auVar234._16_4_ * fVar217 * 12.0 + auVar234._16_4_ * 0.0 * 6.0 + auVar94._16_4_ + 0.0) *
         0.16666667;
    auVar115._20_4_ =
         (auVar234._20_4_ * fVar176 * 12.0 + auVar234._20_4_ * 0.0 * 6.0 + auVar94._20_4_ + 0.0) *
         0.16666667;
    auVar115._24_4_ =
         (auVar234._24_4_ * fVar10 * 12.0 + auVar234._24_4_ * 0.0 * 6.0 + auVar94._24_4_ + 0.0) *
         0.16666667;
    auVar115._28_4_ = fVar29;
    auVar116._4_4_ =
         (auVar84._4_4_ + fVar153 + auVar234._4_4_ * fVar232 * 12.0 + auVar234._4_4_ * fVar231 * 6.0
         ) * 0.16666667;
    auVar116._0_4_ =
         (auVar84._0_4_ + fVar138 + auVar234._0_4_ * fVar230 * 12.0 + auVar234._0_4_ * fVar227 * 6.0
         ) * 0.16666667;
    auVar116._8_4_ =
         (auVar84._8_4_ + fVar154 + auVar234._8_4_ * fVar208 * 12.0 + auVar234._8_4_ * fVar207 * 6.0
         ) * 0.16666667;
    auVar116._12_4_ =
         (auVar84._12_4_ + fVar155 +
         auVar234._12_4_ * fVar199 * 12.0 + auVar234._12_4_ * fVar209 * 6.0) * 0.16666667;
    auVar116._16_4_ =
         (auVar84._16_4_ + fVar156 + auVar234._16_4_ * 0.0 * 12.0 + auVar234._16_4_ * fVar217 * 6.0)
         * 0.16666667;
    auVar116._20_4_ =
         (auVar84._20_4_ + fVar157 + auVar234._20_4_ * 0.0 * 12.0 + auVar234._20_4_ * fVar176 * 6.0)
         * 0.16666667;
    auVar116._24_4_ =
         (auVar84._24_4_ + fVar158 + auVar234._24_4_ * 0.0 * 12.0 + auVar234._24_4_ * fVar10 * 6.0)
         * 0.16666667;
    auVar116._28_4_ = auVar243._28_4_;
    fVar175 = fVar175 * 0.16666667;
    fVar196 = fVar196 * 0.16666667;
    fVar197 = fVar197 * 0.16666667;
    fVar198 = fVar198 * 0.16666667;
    auVar119._28_4_ = fVar221;
    auVar119._0_28_ = ZEXT1628(CONCAT412(fVar198,CONCAT48(fVar197,CONCAT44(fVar196,fVar175))));
    auVar94 = vmulps_avx512vl(local_260,auVar119);
    auVar84 = vmulps_avx512vl(local_280,auVar119);
    auVar120._4_4_ = local_2a0._4_4_ * fVar196;
    auVar120._0_4_ = local_2a0._0_4_ * fVar175;
    auVar120._8_4_ = local_2a0._8_4_ * fVar197;
    auVar120._12_4_ = local_2a0._12_4_ * fVar198;
    auVar120._16_4_ = local_2a0._16_4_ * 0.0;
    auVar120._20_4_ = local_2a0._20_4_ * 0.0;
    auVar120._24_4_ = local_2a0._24_4_ * 0.0;
    auVar120._28_4_ = auVar139._0_4_;
    auVar30._4_4_ = local_2c0._4_4_ * fVar196;
    auVar30._0_4_ = local_2c0._0_4_ * fVar175;
    auVar30._8_4_ = local_2c0._8_4_ * fVar197;
    auVar30._12_4_ = local_2c0._12_4_ * fVar198;
    auVar30._16_4_ = local_2c0._16_4_ * 0.0;
    auVar30._20_4_ = local_2c0._20_4_ * 0.0;
    auVar30._24_4_ = local_2c0._24_4_ * 0.0;
    auVar30._28_4_ = fVar221;
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar116,auVar247._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar116,auVar248._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar249._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar30,auVar93,auVar116);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar115,auVar90);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar115,auVar87);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar115,auVar91);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar92,auVar115);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar114,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar84,auVar114,auVar85);
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar114,auVar86);
    auVar84 = vfmadd231ps_avx512vl(auVar81,auVar89,auVar114);
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar81 = vxorps_avx512vl(auVar83,auVar95);
    auVar94 = vxorps_avx512vl(ZEXT1632(auVar72),auVar95);
    auVar215._0_4_ = auVar94._0_4_ * fVar230;
    auVar215._4_4_ = auVar94._4_4_ * fVar232;
    auVar215._8_4_ = auVar94._8_4_ * fVar208;
    auVar215._12_4_ = auVar94._12_4_ * fVar199;
    auVar215._16_4_ = auVar94._16_4_ * 0.0;
    auVar215._20_4_ = auVar94._20_4_ * 0.0;
    auVar215._24_4_ = auVar94._24_4_ * 0.0;
    auVar215._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar234._0_32_,auVar82);
    auVar94 = vsubps_avx(auVar215,auVar99);
    auVar31._4_4_ = auVar81._4_4_ * fVar231 * 0.5;
    auVar31._0_4_ = auVar81._0_4_ * fVar227 * 0.5;
    auVar31._8_4_ = auVar81._8_4_ * fVar207 * 0.5;
    auVar31._12_4_ = auVar81._12_4_ * fVar209 * 0.5;
    auVar31._16_4_ = auVar81._16_4_ * fVar217 * 0.5;
    auVar31._20_4_ = auVar81._20_4_ * fVar176 * 0.5;
    auVar31._24_4_ = auVar81._24_4_ * fVar10 * 0.5;
    auVar31._28_4_ = auVar83._28_4_;
    auVar32._4_4_ = auVar94._4_4_ * 0.5;
    auVar32._0_4_ = auVar94._0_4_ * 0.5;
    auVar32._8_4_ = auVar94._8_4_ * 0.5;
    auVar32._12_4_ = auVar94._12_4_ * 0.5;
    auVar32._16_4_ = auVar94._16_4_ * 0.5;
    auVar32._20_4_ = auVar94._20_4_ * 0.5;
    auVar32._24_4_ = auVar94._24_4_ * 0.5;
    auVar32._28_4_ = auVar94._28_4_;
    auVar33._4_4_ = (auVar99._4_4_ + fVar231 * fVar231) * 0.5;
    auVar33._0_4_ = (auVar99._0_4_ + fVar227 * fVar227) * 0.5;
    auVar33._8_4_ = (auVar99._8_4_ + fVar207 * fVar207) * 0.5;
    auVar33._12_4_ = (auVar99._12_4_ + fVar209 * fVar209) * 0.5;
    auVar33._16_4_ = (auVar99._16_4_ + fVar217 * fVar217) * 0.5;
    auVar33._20_4_ = (auVar99._20_4_ + fVar176 * fVar176) * 0.5;
    auVar33._24_4_ = (auVar99._24_4_ + fVar10 * fVar10) * 0.5;
    auVar33._28_4_ = auVar99._28_4_ + auVar226._28_4_;
    fVar227 = fVar230 * fVar230 * 0.5;
    fVar230 = fVar232 * fVar232 * 0.5;
    fVar231 = fVar208 * fVar208 * 0.5;
    fVar232 = fVar199 * fVar199 * 0.5;
    auVar34._28_4_ = auVar229._28_4_;
    auVar34._0_28_ = ZEXT1628(CONCAT412(fVar232,CONCAT48(fVar231,CONCAT44(fVar230,fVar227))));
    auVar94 = vmulps_avx512vl(local_260,auVar34);
    auVar83 = vmulps_avx512vl(local_280,auVar34);
    auVar35._4_4_ = local_2a0._4_4_ * fVar230;
    auVar35._0_4_ = local_2a0._0_4_ * fVar227;
    auVar35._8_4_ = local_2a0._8_4_ * fVar231;
    auVar35._12_4_ = local_2a0._12_4_ * fVar232;
    auVar35._16_4_ = local_2a0._16_4_ * 0.0;
    auVar35._20_4_ = local_2a0._20_4_ * 0.0;
    auVar35._24_4_ = local_2a0._24_4_ * 0.0;
    auVar35._28_4_ = fVar29;
    auVar36._4_4_ = fVar230 * local_2c0._4_4_;
    auVar36._0_4_ = fVar227 * local_2c0._0_4_;
    auVar36._8_4_ = fVar231 * local_2c0._8_4_;
    auVar36._12_4_ = fVar232 * local_2c0._12_4_;
    auVar36._16_4_ = local_2c0._16_4_ * 0.0;
    auVar36._20_4_ = local_2c0._20_4_ * 0.0;
    auVar36._24_4_ = local_2c0._24_4_ * 0.0;
    auVar36._28_4_ = auVar229._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar33,auVar247._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar33,auVar248._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar35,auVar33,auVar249._0_32_);
    auVar72 = vfmadd231ps_fma(auVar36,auVar93,auVar33);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar32,auVar90);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar32,auVar87);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar32,auVar91);
    auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),auVar92,auVar32);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar31,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar31,auVar85);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar31,auVar86);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar31);
    auVar37._4_4_ = auVar94._4_4_ * fVar11;
    auVar37._0_4_ = auVar94._0_4_ * fVar11;
    auVar37._8_4_ = auVar94._8_4_ * fVar11;
    auVar37._12_4_ = auVar94._12_4_ * fVar11;
    auVar37._16_4_ = auVar94._16_4_ * fVar11;
    auVar37._20_4_ = auVar94._20_4_ * fVar11;
    auVar37._24_4_ = auVar94._24_4_ * fVar11;
    auVar37._28_4_ = auVar93._28_4_;
    auVar243 = ZEXT3264(auVar37);
    auVar38._4_4_ = auVar83._4_4_ * fVar11;
    auVar38._0_4_ = auVar83._0_4_ * fVar11;
    auVar38._8_4_ = auVar83._8_4_ * fVar11;
    auVar38._12_4_ = auVar83._12_4_ * fVar11;
    auVar38._16_4_ = auVar83._16_4_ * fVar11;
    auVar38._20_4_ = auVar83._20_4_ * fVar11;
    auVar38._24_4_ = auVar83._24_4_ * fVar11;
    auVar38._28_4_ = 0x3e2aaaab;
    auVar39._4_4_ = auVar81._4_4_ * fVar11;
    auVar39._0_4_ = auVar81._0_4_ * fVar11;
    auVar39._8_4_ = auVar81._8_4_ * fVar11;
    auVar39._12_4_ = auVar81._12_4_ * fVar11;
    auVar39._16_4_ = auVar81._16_4_ * fVar11;
    auVar39._20_4_ = auVar81._20_4_ * fVar11;
    auVar39._24_4_ = auVar81._24_4_ * fVar11;
    auVar39._28_4_ = 0x40c00000;
    fVar227 = auVar99._0_4_ * fVar11;
    fVar230 = auVar99._4_4_ * fVar11;
    auVar40._4_4_ = fVar230;
    auVar40._0_4_ = fVar227;
    fVar231 = auVar99._8_4_ * fVar11;
    auVar40._8_4_ = fVar231;
    fVar232 = auVar99._12_4_ * fVar11;
    auVar40._12_4_ = fVar232;
    fVar207 = auVar99._16_4_ * fVar11;
    auVar40._16_4_ = fVar207;
    fVar208 = auVar99._20_4_ * fVar11;
    auVar40._20_4_ = fVar208;
    fVar209 = auVar99._24_4_ * fVar11;
    auVar40._24_4_ = fVar209;
    auVar40._28_4_ = fVar11;
    auVar72 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar72));
    auVar233 = ZEXT3264(auVar99);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,ZEXT1632(auVar72));
    auVar95 = ZEXT1632(auVar72);
    auVar101 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar95);
    auVar237 = ZEXT3264(auVar101);
    auVar216._0_4_ = fVar227 + auVar84._0_4_;
    auVar216._4_4_ = fVar230 + auVar84._4_4_;
    auVar216._8_4_ = fVar231 + auVar84._8_4_;
    auVar216._12_4_ = fVar232 + auVar84._12_4_;
    auVar216._16_4_ = fVar207 + auVar84._16_4_;
    auVar216._20_4_ = fVar208 + auVar84._20_4_;
    auVar216._24_4_ = fVar209 + auVar84._24_4_;
    auVar216._28_4_ = fVar11 + auVar84._28_4_;
    auVar94 = vmaxps_avx(auVar84,auVar216);
    auVar83 = vminps_avx(auVar84,auVar216);
    auVar102 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,auVar95);
    auVar103 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar95);
    auVar104 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar95);
    auVar116 = ZEXT1632(auVar72);
    auVar105 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar116);
    auVar84 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar116);
    auVar106 = vsubps_avx512vl(auVar102,auVar84);
    auVar84 = vsubps_avx(auVar99,auVar96);
    auVar229 = ZEXT3264(auVar84);
    auVar95 = vsubps_avx(auVar100,auVar97);
    auVar226 = ZEXT3264(auVar95);
    auVar81 = vsubps_avx(auVar101,auVar98);
    auVar107 = vmulps_avx512vl(auVar95,auVar39);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar38,auVar81);
    auVar108 = vmulps_avx512vl(auVar81,auVar37);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar39,auVar84);
    auVar109 = vmulps_avx512vl(auVar84,auVar38);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar37,auVar95);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar108 = vmulps_avx512vl(auVar81,auVar81);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,auVar95);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar84,auVar84);
    auVar109 = vrcp14ps_avx512vl(auVar108);
    auVar110 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar250);
    auVar109 = vfmadd132ps_avx512vl(auVar110,auVar109,auVar109);
    auVar107 = vmulps_avx512vl(auVar107,auVar109);
    auVar110 = vmulps_avx512vl(auVar95,auVar105);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar104,auVar81);
    auVar111 = vmulps_avx512vl(auVar81,auVar103);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar105,auVar84);
    auVar112 = vmulps_avx512vl(auVar84,auVar104);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar103,auVar95);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar110,auVar109);
    auVar107 = vmaxps_avx512vl(auVar107,auVar109);
    auVar107 = vsqrtps_avx512vl(auVar107);
    auVar109 = vmaxps_avx512vl(auVar106,auVar102);
    auVar94 = vmaxps_avx512vl(auVar94,auVar109);
    auVar112 = vaddps_avx512vl(auVar107,auVar94);
    auVar94 = vminps_avx512vl(auVar106,auVar102);
    auVar94 = vminps_avx(auVar83,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar107);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar83 = vmulps_avx512vl(auVar112,auVar109);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    auVar94 = vmulps_avx512vl(auVar94,auVar110);
    auVar83 = vmulps_avx512vl(auVar83,auVar83);
    auVar102 = vrsqrt14ps_avx512vl(auVar108);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar106 = vmulps_avx512vl(auVar108,auVar111);
    fVar227 = auVar102._0_4_;
    fVar230 = auVar102._4_4_;
    fVar231 = auVar102._8_4_;
    fVar232 = auVar102._12_4_;
    fVar207 = auVar102._16_4_;
    fVar208 = auVar102._20_4_;
    fVar209 = auVar102._24_4_;
    auVar41._4_4_ = fVar230 * fVar230 * fVar230 * auVar106._4_4_;
    auVar41._0_4_ = fVar227 * fVar227 * fVar227 * auVar106._0_4_;
    auVar41._8_4_ = fVar231 * fVar231 * fVar231 * auVar106._8_4_;
    auVar41._12_4_ = fVar232 * fVar232 * fVar232 * auVar106._12_4_;
    auVar41._16_4_ = fVar207 * fVar207 * fVar207 * auVar106._16_4_;
    auVar41._20_4_ = fVar208 * fVar208 * fVar208 * auVar106._20_4_;
    auVar41._24_4_ = fVar209 * fVar209 * fVar209 * auVar106._24_4_;
    auVar41._28_4_ = auVar112._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar41,auVar102,auVar112);
    auVar106 = vmulps_avx512vl(auVar84,auVar102);
    auVar107 = vmulps_avx512vl(auVar95,auVar102);
    auVar108 = vmulps_avx512vl(auVar81,auVar102);
    auVar109 = vsubps_avx512vl(auVar116,auVar96);
    auVar110 = vsubps_avx512vl(auVar116,auVar97);
    auVar111 = vsubps_avx512vl(auVar116,auVar98);
    auVar112 = vmulps_avx512vl(local_480,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_460,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_440,auVar109);
    auVar113 = vmulps_avx512vl(auVar111,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar109);
    auVar114 = vmulps_avx512vl(local_480,auVar108);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar107,local_460);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar106,local_440);
    auVar108 = vmulps_avx512vl(auVar111,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar106);
    auVar107 = vmulps_avx512vl(auVar114,auVar114);
    auVar108 = vsubps_avx512vl(local_220,auVar107);
    auVar115 = vmulps_avx512vl(auVar114,auVar106);
    auVar112 = vsubps_avx512vl(auVar112,auVar115);
    auVar112 = vaddps_avx512vl(auVar112,auVar112);
    auVar115 = vmulps_avx512vl(auVar106,auVar106);
    local_740 = vsubps_avx512vl(auVar113,auVar115);
    auVar83 = vsubps_avx512vl(local_740,auVar83);
    local_7e0 = vmulps_avx512vl(auVar112,auVar112);
    _local_800 = vmulps_avx512vl(auVar108,auVar82);
    auVar82 = vmulps_avx512vl(_local_800,auVar83);
    auVar82 = vsubps_avx512vl(local_7e0,auVar82);
    uVar68 = vcmpps_avx512vl(auVar82,auVar116,5);
    bVar58 = (byte)uVar68;
    if (bVar58 == 0) {
LAB_019d6dcc:
      auVar220 = ZEXT3264(_DAT_01f7b040);
      auVar247 = ZEXT3264(local_840);
      auVar248 = ZEXT3264(local_860);
      auVar249 = ZEXT3264(local_880);
    }
    else {
      auVar82 = vsqrtps_avx512vl(auVar82);
      auVar113 = vaddps_avx512vl(auVar108,auVar108);
      local_820 = vrcp14ps_avx512vl(auVar113);
      auVar115 = vfnmadd213ps_avx512vl(local_820,auVar113,auVar250);
      auVar115 = vfmadd132ps_avx512vl(auVar115,local_820,local_820);
      auVar250._8_4_ = 0x80000000;
      auVar250._0_8_ = 0x8000000080000000;
      auVar250._12_4_ = 0x80000000;
      auVar250._16_4_ = 0x80000000;
      auVar250._20_4_ = 0x80000000;
      auVar250._24_4_ = 0x80000000;
      auVar250._28_4_ = 0x80000000;
      _local_5a0 = vxorps_avx512vl(auVar112,auVar250);
      auVar116 = vsubps_avx512vl(_local_5a0,auVar82);
      local_580 = vmulps_avx512vl(auVar116,auVar115);
      auVar82 = vsubps_avx512vl(auVar82,auVar112);
      local_5c0 = vmulps_avx512vl(auVar82,auVar115);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vblendmps_avx512vl(auVar82,local_580);
      auVar117._0_4_ =
           (uint)(bVar58 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar82._0_4_;
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar67 * auVar115._4_4_ | (uint)!bVar67 * auVar82._4_4_;
      bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar67 * auVar115._8_4_ | (uint)!bVar67 * auVar82._8_4_;
      bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar67 * auVar115._12_4_ | (uint)!bVar67 * auVar82._12_4_;
      bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar67 * auVar115._16_4_ | (uint)!bVar67 * auVar82._16_4_;
      bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar67 * auVar115._20_4_ | (uint)!bVar67 * auVar82._20_4_;
      bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar67 * auVar115._24_4_ | (uint)!bVar67 * auVar82._24_4_;
      bVar67 = SUB81(uVar68 >> 7,0);
      auVar117._28_4_ = (uint)bVar67 * auVar115._28_4_ | (uint)!bVar67 * auVar82._28_4_;
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar82,local_5c0);
      auVar118._0_4_ =
           (uint)(bVar58 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar82._0_4_;
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar67 * auVar115._4_4_ | (uint)!bVar67 * auVar82._4_4_;
      bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar67 * auVar115._8_4_ | (uint)!bVar67 * auVar82._8_4_;
      bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar67 * auVar115._12_4_ | (uint)!bVar67 * auVar82._12_4_;
      bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar67 * auVar115._16_4_ | (uint)!bVar67 * auVar82._16_4_;
      bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar67 * auVar115._20_4_ | (uint)!bVar67 * auVar82._20_4_;
      bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar67 * auVar115._24_4_ | (uint)!bVar67 * auVar82._24_4_;
      bVar67 = SUB81(uVar68 >> 7,0);
      auVar118._28_4_ = (uint)bVar67 * auVar115._28_4_ | (uint)!bVar67 * auVar82._28_4_;
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar82);
      local_5e0 = vmaxps_avx512vl(local_240,auVar82);
      auVar22._8_4_ = 0x36000000;
      auVar22._0_8_ = 0x3600000036000000;
      auVar22._12_4_ = 0x36000000;
      auVar22._16_4_ = 0x36000000;
      auVar22._20_4_ = 0x36000000;
      auVar22._24_4_ = 0x36000000;
      auVar22._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar22);
      vandps_avx512vl(auVar108,auVar82);
      uVar62 = vcmpps_avx512vl(local_600,local_600,1);
      uVar68 = uVar68 & uVar62;
      bVar64 = (byte)uVar68;
      if (bVar64 != 0) {
        uVar62 = vcmpps_avx512vl(auVar83,_DAT_01f7b000,2);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar107 = vblendmps_avx512vl(auVar83,auVar82);
        bVar61 = (byte)uVar62;
        uVar69 = (uint)(bVar61 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar61 & 1) * local_600._0_4_;
        bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
        uVar130 = (uint)bVar67 * auVar107._4_4_ | (uint)!bVar67 * local_600._4_4_;
        bVar67 = (bool)((byte)(uVar62 >> 2) & 1);
        uVar131 = (uint)bVar67 * auVar107._8_4_ | (uint)!bVar67 * local_600._8_4_;
        bVar67 = (bool)((byte)(uVar62 >> 3) & 1);
        uVar132 = (uint)bVar67 * auVar107._12_4_ | (uint)!bVar67 * local_600._12_4_;
        bVar67 = (bool)((byte)(uVar62 >> 4) & 1);
        uVar133 = (uint)bVar67 * auVar107._16_4_ | (uint)!bVar67 * local_600._16_4_;
        bVar67 = (bool)((byte)(uVar62 >> 5) & 1);
        uVar134 = (uint)bVar67 * auVar107._20_4_ | (uint)!bVar67 * local_600._20_4_;
        bVar67 = (bool)((byte)(uVar62 >> 6) & 1);
        uVar135 = (uint)bVar67 * auVar107._24_4_ | (uint)!bVar67 * local_600._24_4_;
        bVar67 = SUB81(uVar62 >> 7,0);
        uVar136 = (uint)bVar67 * auVar107._28_4_ | (uint)!bVar67 * local_600._28_4_;
        auVar117._0_4_ = (bVar64 & 1) * uVar69 | !(bool)(bVar64 & 1) * auVar117._0_4_;
        bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar117._4_4_ = bVar67 * uVar130 | !bVar67 * auVar117._4_4_;
        bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar117._8_4_ = bVar67 * uVar131 | !bVar67 * auVar117._8_4_;
        bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar117._12_4_ = bVar67 * uVar132 | !bVar67 * auVar117._12_4_;
        bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar117._16_4_ = bVar67 * uVar133 | !bVar67 * auVar117._16_4_;
        bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar117._20_4_ = bVar67 * uVar134 | !bVar67 * auVar117._20_4_;
        bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar117._24_4_ = bVar67 * uVar135 | !bVar67 * auVar117._24_4_;
        bVar67 = SUB81(uVar68 >> 7,0);
        auVar117._28_4_ = bVar67 * uVar136 | !bVar67 * auVar117._28_4_;
        auVar83 = vblendmps_avx512vl(auVar82,auVar83);
        bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar9 = SUB81(uVar62 >> 7,0);
        auVar118._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar61 & 1) * auVar83._0_4_ | !(bool)(bVar61 & 1) * uVar69) |
             !(bool)(bVar64 & 1) * auVar118._0_4_;
        bVar3 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar118._4_4_ =
             (uint)bVar3 * ((uint)bVar67 * auVar83._4_4_ | !bVar67 * uVar130) |
             !bVar3 * auVar118._4_4_;
        bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar118._8_4_ =
             (uint)bVar67 * ((uint)bVar4 * auVar83._8_4_ | !bVar4 * uVar131) |
             !bVar67 * auVar118._8_4_;
        bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar118._12_4_ =
             (uint)bVar67 * ((uint)bVar5 * auVar83._12_4_ | !bVar5 * uVar132) |
             !bVar67 * auVar118._12_4_;
        bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar118._16_4_ =
             (uint)bVar67 * ((uint)bVar6 * auVar83._16_4_ | !bVar6 * uVar133) |
             !bVar67 * auVar118._16_4_;
        bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar118._20_4_ =
             (uint)bVar67 * ((uint)bVar7 * auVar83._20_4_ | !bVar7 * uVar134) |
             !bVar67 * auVar118._20_4_;
        bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar118._24_4_ =
             (uint)bVar67 * ((uint)bVar8 * auVar83._24_4_ | !bVar8 * uVar135) |
             !bVar67 * auVar118._24_4_;
        bVar67 = SUB81(uVar68 >> 7,0);
        auVar118._28_4_ =
             (uint)bVar67 * ((uint)bVar9 * auVar83._28_4_ | !bVar9 * uVar136) |
             !bVar67 * auVar118._28_4_;
        bVar58 = (~bVar64 | bVar61) & bVar58;
      }
      if ((bVar58 & 0x7f) == 0) {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar251 = ZEXT3264(auVar94);
        auVar220 = ZEXT3264(_DAT_01f7b040);
        auVar247 = ZEXT3264(local_840);
        auVar248 = ZEXT3264(local_860);
        auVar249 = ZEXT3264(local_880);
      }
      else {
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar82 = vxorps_avx512vl(auVar105,auVar83);
        auVar103 = vxorps_avx512vl(auVar103,auVar83);
        auVar220 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        auVar104 = vxorps_avx512vl(auVar104,auVar83);
        auVar72 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                                 ZEXT416((uint)local_650._0_4_));
        auVar105 = vbroadcastss_avx512vl(auVar72);
        auVar105 = vminps_avx512vl(auVar105,auVar118);
        auVar57._4_4_ = fStack_2dc;
        auVar57._0_4_ = local_2e0;
        auVar57._8_4_ = fStack_2d8;
        auVar57._12_4_ = fStack_2d4;
        auVar57._16_4_ = fStack_2d0;
        auVar57._20_4_ = fStack_2cc;
        auVar57._24_4_ = fStack_2c8;
        auVar57._28_4_ = fStack_2c4;
        auVar107 = vmaxps_avx512vl(auVar57,auVar117);
        auVar108 = vmulps_avx512vl(auVar39,auVar111);
        auVar108 = vfmadd213ps_avx512vl(auVar110,auVar38,auVar108);
        auVar72 = vfmadd213ps_fma(auVar109,auVar37,auVar108);
        auVar108 = vmulps_avx512vl(local_480,auVar39);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_460,auVar38);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_440,auVar37);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar108,auVar109);
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar12 = vcmpps_avx512vl(auVar109,auVar110,1);
        auVar111 = vxorps_avx512vl(ZEXT1632(auVar72),auVar83);
        auVar115 = vrcp14ps_avx512vl(auVar108);
        auVar116 = vxorps_avx512vl(auVar108,auVar83);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar120 = vfnmadd213ps_avx512vl(auVar115,auVar108,auVar119);
        auVar72 = vfmadd132ps_fma(auVar120,auVar115,auVar115);
        fVar227 = auVar72._0_4_ * auVar111._0_4_;
        fVar230 = auVar72._4_4_ * auVar111._4_4_;
        auVar42._4_4_ = fVar230;
        auVar42._0_4_ = fVar227;
        fVar231 = auVar72._8_4_ * auVar111._8_4_;
        auVar42._8_4_ = fVar231;
        fVar232 = auVar72._12_4_ * auVar111._12_4_;
        auVar42._12_4_ = fVar232;
        fVar207 = auVar111._16_4_ * 0.0;
        auVar42._16_4_ = fVar207;
        fVar208 = auVar111._20_4_ * 0.0;
        auVar42._20_4_ = fVar208;
        fVar209 = auVar111._24_4_ * 0.0;
        auVar42._24_4_ = fVar209;
        auVar42._28_4_ = auVar111._28_4_;
        uVar14 = vcmpps_avx512vl(auVar108,auVar116,1);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar241._8_4_ = 0xff800000;
        auVar241._0_8_ = 0xff800000ff800000;
        auVar241._12_4_ = 0xff800000;
        auVar241._16_4_ = 0xff800000;
        auVar241._20_4_ = 0xff800000;
        auVar241._24_4_ = 0xff800000;
        auVar241._28_4_ = 0xff800000;
        auVar115 = vblendmps_avx512vl(auVar42,auVar241);
        auVar121._0_4_ = (uint)(bVar64 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar64 & 1) * -0x800000
        ;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar67 * auVar115._4_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar67 * auVar115._8_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar67 * auVar115._12_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar67 * auVar115._16_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar67 * auVar115._20_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar67 * auVar115._24_4_ | (uint)!bVar67 * -0x800000;
        auVar121._28_4_ =
             (uint)(bVar64 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar64 >> 7) * -0x800000;
        auVar115 = vmaxps_avx512vl(auVar107,auVar121);
        auVar243 = ZEXT3264(auVar115);
        uVar14 = vcmpps_avx512vl(auVar108,auVar116,6);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar122._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar227;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar230;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar231;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar232;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar207;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar208;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar209;
        auVar122._28_4_ =
             (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar111._28_4_;
        auVar105 = vminps_avx512vl(auVar105,auVar122);
        auVar72 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
        auVar99 = vsubps_avx512vl(ZEXT1632(auVar72),auVar99);
        auVar100 = vsubps_avx512vl(ZEXT1632(auVar72),auVar100);
        auVar107 = ZEXT1632(auVar72);
        auVar101 = vsubps_avx512vl(auVar107,auVar101);
        auVar101 = vmulps_avx512vl(auVar101,auVar82);
        auVar100 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar100);
        auVar99 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar99);
        auVar82 = vmulps_avx512vl(local_480,auVar82);
        auVar82 = vfmadd231ps_avx512vl(auVar82,local_460,auVar104);
        auVar251 = ZEXT3264(auVar119);
        auVar82 = vfmadd231ps_avx512vl(auVar82,local_440,auVar103);
        vandps_avx512vl(auVar82,auVar109);
        uVar12 = vcmpps_avx512vl(auVar82,auVar110,1);
        auVar99 = vxorps_avx512vl(auVar99,auVar83);
        auVar100 = vrcp14ps_avx512vl(auVar82);
        auVar83 = vxorps_avx512vl(auVar82,auVar83);
        auVar237 = ZEXT3264(auVar83);
        auVar101 = vfnmadd213ps_avx512vl(auVar100,auVar82,auVar119);
        auVar72 = vfmadd132ps_fma(auVar101,auVar100,auVar100);
        fVar227 = auVar72._0_4_ * auVar99._0_4_;
        fVar230 = auVar72._4_4_ * auVar99._4_4_;
        auVar43._4_4_ = fVar230;
        auVar43._0_4_ = fVar227;
        fVar231 = auVar72._8_4_ * auVar99._8_4_;
        auVar43._8_4_ = fVar231;
        fVar232 = auVar72._12_4_ * auVar99._12_4_;
        auVar43._12_4_ = fVar232;
        fVar207 = auVar99._16_4_ * 0.0;
        auVar43._16_4_ = fVar207;
        fVar208 = auVar99._20_4_ * 0.0;
        auVar43._20_4_ = fVar208;
        fVar209 = auVar99._24_4_ * 0.0;
        auVar43._24_4_ = fVar209;
        auVar43._28_4_ = auVar99._28_4_;
        uVar14 = vcmpps_avx512vl(auVar82,auVar83,1);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar23._8_4_ = 0xff800000;
        auVar23._0_8_ = 0xff800000ff800000;
        auVar23._12_4_ = 0xff800000;
        auVar23._16_4_ = 0xff800000;
        auVar23._20_4_ = 0xff800000;
        auVar23._24_4_ = 0xff800000;
        auVar23._28_4_ = 0xff800000;
        auVar101 = vblendmps_avx512vl(auVar43,auVar23);
        auVar123._0_4_ =
             (uint)(bVar64 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar100._0_4_;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * auVar100._4_4_;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * auVar100._8_4_;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * auVar100._12_4_;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * auVar100._16_4_;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * auVar100._20_4_;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar67 * auVar101._24_4_ | (uint)!bVar67 * auVar100._24_4_;
        auVar123._28_4_ =
             (uint)(bVar64 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar100._28_4_;
        local_420 = vmaxps_avx(auVar115,auVar123);
        uVar14 = vcmpps_avx512vl(auVar82,auVar83,6);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar124._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar227;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar230;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar231;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar232;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar207;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar208;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar209;
        auVar124._28_4_ =
             (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar99._28_4_;
        local_340 = vminps_avx(auVar105,auVar124);
        auVar233 = ZEXT3264(local_340);
        uVar12 = vcmpps_avx512vl(local_420,local_340,2);
        bVar58 = bVar58 & 0x7f & (byte)uVar12;
        if (bVar58 == 0) goto LAB_019d6dcc;
        auVar83 = vmaxps_avx512vl(auVar107,auVar94);
        auVar94 = vfmadd213ps_avx512vl(local_580,auVar114,auVar106);
        fVar227 = auVar102._0_4_;
        fVar230 = auVar102._4_4_;
        auVar44._4_4_ = fVar230 * auVar94._4_4_;
        auVar44._0_4_ = fVar227 * auVar94._0_4_;
        fVar231 = auVar102._8_4_;
        auVar44._8_4_ = fVar231 * auVar94._8_4_;
        fVar232 = auVar102._12_4_;
        auVar44._12_4_ = fVar232 * auVar94._12_4_;
        fVar207 = auVar102._16_4_;
        auVar44._16_4_ = fVar207 * auVar94._16_4_;
        fVar208 = auVar102._20_4_;
        auVar44._20_4_ = fVar208 * auVar94._20_4_;
        fVar209 = auVar102._24_4_;
        auVar44._24_4_ = fVar209 * auVar94._24_4_;
        auVar44._28_4_ = auVar94._28_4_;
        auVar94 = vfmadd213ps_avx512vl(local_5c0,auVar114,auVar106);
        auVar45._4_4_ = fVar230 * auVar94._4_4_;
        auVar45._0_4_ = fVar227 * auVar94._0_4_;
        auVar45._8_4_ = fVar231 * auVar94._8_4_;
        auVar45._12_4_ = fVar232 * auVar94._12_4_;
        auVar45._16_4_ = fVar207 * auVar94._16_4_;
        auVar45._20_4_ = fVar208 * auVar94._20_4_;
        auVar45._24_4_ = fVar209 * auVar94._24_4_;
        auVar45._28_4_ = auVar94._28_4_;
        auVar94 = vminps_avx512vl(auVar44,auVar119);
        auVar52 = ZEXT812(0);
        auVar82 = ZEXT1232(auVar52) << 0x20;
        auVar94 = vmaxps_avx(auVar94,ZEXT1232(auVar52) << 0x20);
        auVar99 = vminps_avx512vl(auVar45,auVar119);
        auVar46._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar94._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar46,local_720,auVar214);
        auVar94 = vmaxps_avx(auVar99,ZEXT1232(auVar52) << 0x20);
        auVar47._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar94._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar47,local_720,auVar214);
        auVar48._4_4_ = auVar83._4_4_ * auVar83._4_4_;
        auVar48._0_4_ = auVar83._0_4_ * auVar83._0_4_;
        auVar48._8_4_ = auVar83._8_4_ * auVar83._8_4_;
        auVar48._12_4_ = auVar83._12_4_ * auVar83._12_4_;
        auVar48._16_4_ = auVar83._16_4_ * auVar83._16_4_;
        auVar48._20_4_ = auVar83._20_4_ * auVar83._20_4_;
        auVar48._24_4_ = auVar83._24_4_ * auVar83._24_4_;
        auVar48._28_4_ = auVar83._28_4_;
        auVar94 = vsubps_avx(local_740,auVar48);
        auVar49._4_4_ = auVar94._4_4_ * (float)local_800._4_4_;
        auVar49._0_4_ = auVar94._0_4_ * (float)local_800._0_4_;
        auVar49._8_4_ = auVar94._8_4_ * fStack_7f8;
        auVar49._12_4_ = auVar94._12_4_ * fStack_7f4;
        auVar49._16_4_ = auVar94._16_4_ * fStack_7f0;
        auVar49._20_4_ = auVar94._20_4_ * fStack_7ec;
        auVar49._24_4_ = auVar94._24_4_ * fStack_7e8;
        auVar49._28_4_ = auVar83._28_4_;
        auVar83 = vsubps_avx(local_7e0,auVar49);
        uVar12 = vcmpps_avx512vl(auVar83,ZEXT1232(auVar52) << 0x20,5);
        bVar64 = (byte)uVar12;
        auVar247 = ZEXT3264(local_840);
        auVar248 = ZEXT3264(local_860);
        auVar249 = ZEXT3264(local_880);
        if (bVar64 == 0) {
          bVar64 = 0;
          auVar84 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar226 = ZEXT864(0) << 0x20;
          auVar83 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar235 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar126._8_4_ = 0xff800000;
          auVar126._0_8_ = 0xff800000ff800000;
          auVar126._12_4_ = 0xff800000;
          auVar126._16_4_ = 0xff800000;
          auVar126._20_4_ = 0xff800000;
          auVar126._24_4_ = 0xff800000;
          auVar126._28_4_ = 0xff800000;
        }
        else {
          auVar73 = vxorps_avx512vl(auVar139,auVar139);
          uVar68 = vcmpps_avx512vl(auVar83,auVar107,5);
          auVar83 = vsqrtps_avx(auVar83);
          auVar82 = vfnmadd213ps_avx512vl(auVar113,local_820,auVar119);
          auVar100 = vfmadd132ps_avx512vl(auVar82,local_820,local_820);
          auVar82 = vsubps_avx(_local_5a0,auVar83);
          auVar101 = vmulps_avx512vl(auVar82,auVar100);
          auVar83 = vsubps_avx512vl(auVar83,auVar112);
          auVar100 = vmulps_avx512vl(auVar83,auVar100);
          auVar83 = vfmadd213ps_avx512vl(auVar114,auVar101,auVar106);
          auVar50._4_4_ = fVar230 * auVar83._4_4_;
          auVar50._0_4_ = fVar227 * auVar83._0_4_;
          auVar50._8_4_ = fVar231 * auVar83._8_4_;
          auVar50._12_4_ = fVar232 * auVar83._12_4_;
          auVar50._16_4_ = fVar207 * auVar83._16_4_;
          auVar50._20_4_ = fVar208 * auVar83._20_4_;
          auVar50._24_4_ = fVar209 * auVar83._24_4_;
          auVar50._28_4_ = auVar99._28_4_;
          auVar83 = vmulps_avx512vl(local_440,auVar101);
          auVar82 = vmulps_avx512vl(local_460,auVar101);
          auVar103 = vmulps_avx512vl(local_480,auVar101);
          auVar99 = vfmadd213ps_avx512vl(auVar84,auVar50,auVar96);
          auVar83 = vsubps_avx512vl(auVar83,auVar99);
          auVar99 = vfmadd213ps_avx512vl(auVar95,auVar50,auVar97);
          auVar99 = vsubps_avx512vl(auVar82,auVar99);
          auVar72 = vfmadd213ps_fma(auVar50,auVar81,auVar98);
          auVar82 = vsubps_avx(auVar103,ZEXT1632(auVar72));
          auVar235 = auVar82._0_28_;
          auVar82 = vfmadd213ps_avx512vl(auVar114,auVar100,auVar106);
          auVar102 = vmulps_avx512vl(auVar102,auVar82);
          auVar82 = vmulps_avx512vl(local_440,auVar100);
          auVar103 = vmulps_avx512vl(local_460,auVar100);
          auVar104 = vmulps_avx512vl(local_480,auVar100);
          auVar72 = vfmadd213ps_fma(auVar84,auVar102,auVar96);
          auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar72));
          auVar72 = vfmadd213ps_fma(auVar95,auVar102,auVar97);
          auVar84 = vsubps_avx512vl(auVar103,ZEXT1632(auVar72));
          auVar72 = vfmadd213ps_fma(auVar81,auVar102,auVar98);
          auVar95 = vsubps_avx512vl(auVar104,ZEXT1632(auVar72));
          auVar226 = ZEXT3264(auVar95);
          auVar146._8_4_ = 0x7f800000;
          auVar146._0_8_ = 0x7f8000007f800000;
          auVar146._12_4_ = 0x7f800000;
          auVar146._16_4_ = 0x7f800000;
          auVar146._20_4_ = 0x7f800000;
          auVar146._24_4_ = 0x7f800000;
          auVar146._28_4_ = 0x7f800000;
          auVar95 = vblendmps_avx512vl(auVar146,auVar101);
          bVar67 = (bool)((byte)uVar68 & 1);
          auVar125._0_4_ = (uint)bVar67 * auVar95._0_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar67 * auVar95._4_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar67 * auVar95._8_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar67 * auVar95._12_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar67 * auVar95._16_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar67 * auVar95._20_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar67 * auVar95._24_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = SUB81(uVar68 >> 7,0);
          auVar125._28_4_ = (uint)bVar67 * auVar95._28_4_ | (uint)!bVar67 * 0x7f800000;
          auVar193._8_4_ = 0xff800000;
          auVar193._0_8_ = 0xff800000ff800000;
          auVar193._12_4_ = 0xff800000;
          auVar193._16_4_ = 0xff800000;
          auVar193._20_4_ = 0xff800000;
          auVar193._24_4_ = 0xff800000;
          auVar193._28_4_ = 0xff800000;
          auVar95 = vblendmps_avx512vl(auVar193,auVar100);
          bVar67 = (bool)((byte)uVar68 & 1);
          auVar126._0_4_ = (uint)bVar67 * auVar95._0_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar67 * auVar95._4_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar67 * auVar95._8_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar67 * auVar95._12_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar67 * auVar95._16_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar67 * auVar95._20_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar67 * auVar95._24_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = SUB81(uVar68 >> 7,0);
          auVar126._28_4_ = (uint)bVar67 * auVar95._28_4_ | (uint)!bVar67 * -0x800000;
          auVar24._8_4_ = 0x36000000;
          auVar24._0_8_ = 0x3600000036000000;
          auVar24._12_4_ = 0x36000000;
          auVar24._16_4_ = 0x36000000;
          auVar24._20_4_ = 0x36000000;
          auVar24._24_4_ = 0x36000000;
          auVar24._28_4_ = 0x36000000;
          auVar95 = vmulps_avx512vl(local_5e0,auVar24);
          uVar62 = vcmpps_avx512vl(auVar95,local_600,0xe);
          uVar68 = uVar68 & uVar62;
          bVar61 = (byte)uVar68;
          if (bVar61 != 0) {
            uVar62 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar73),2);
            auVar228._8_4_ = 0x7f800000;
            auVar228._0_8_ = 0x7f8000007f800000;
            auVar228._12_4_ = 0x7f800000;
            auVar228._16_4_ = 0x7f800000;
            auVar228._20_4_ = 0x7f800000;
            auVar228._24_4_ = 0x7f800000;
            auVar228._28_4_ = 0x7f800000;
            auVar242._8_4_ = 0xff800000;
            auVar242._0_8_ = 0xff800000ff800000;
            auVar242._12_4_ = 0xff800000;
            auVar242._16_4_ = 0xff800000;
            auVar242._20_4_ = 0xff800000;
            auVar242._24_4_ = 0xff800000;
            auVar242._28_4_ = 0xff800000;
            auVar94 = vblendmps_avx512vl(auVar228,auVar242);
            bVar59 = (byte)uVar62;
            uVar69 = (uint)(bVar59 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar95._0_4_;
            bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
            uVar130 = (uint)bVar67 * auVar94._4_4_ | (uint)!bVar67 * auVar95._4_4_;
            bVar67 = (bool)((byte)(uVar62 >> 2) & 1);
            uVar131 = (uint)bVar67 * auVar94._8_4_ | (uint)!bVar67 * auVar95._8_4_;
            bVar67 = (bool)((byte)(uVar62 >> 3) & 1);
            uVar132 = (uint)bVar67 * auVar94._12_4_ | (uint)!bVar67 * auVar95._12_4_;
            bVar67 = (bool)((byte)(uVar62 >> 4) & 1);
            uVar133 = (uint)bVar67 * auVar94._16_4_ | (uint)!bVar67 * auVar95._16_4_;
            bVar67 = (bool)((byte)(uVar62 >> 5) & 1);
            uVar134 = (uint)bVar67 * auVar94._20_4_ | (uint)!bVar67 * auVar95._20_4_;
            bVar67 = (bool)((byte)(uVar62 >> 6) & 1);
            uVar135 = (uint)bVar67 * auVar94._24_4_ | (uint)!bVar67 * auVar95._24_4_;
            bVar67 = SUB81(uVar62 >> 7,0);
            uVar136 = (uint)bVar67 * auVar94._28_4_ | (uint)!bVar67 * auVar95._28_4_;
            auVar125._0_4_ = (bVar61 & 1) * uVar69 | !(bool)(bVar61 & 1) * auVar125._0_4_;
            bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar125._4_4_ = bVar67 * uVar130 | !bVar67 * auVar125._4_4_;
            bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar125._8_4_ = bVar67 * uVar131 | !bVar67 * auVar125._8_4_;
            bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar125._12_4_ = bVar67 * uVar132 | !bVar67 * auVar125._12_4_;
            bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar125._16_4_ = bVar67 * uVar133 | !bVar67 * auVar125._16_4_;
            bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar125._20_4_ = bVar67 * uVar134 | !bVar67 * auVar125._20_4_;
            bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar125._24_4_ = bVar67 * uVar135 | !bVar67 * auVar125._24_4_;
            bVar67 = SUB81(uVar68 >> 7,0);
            auVar125._28_4_ = bVar67 * uVar136 | !bVar67 * auVar125._28_4_;
            auVar94 = vblendmps_avx512vl(auVar242,auVar228);
            bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar62 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar62 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar62 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar62 >> 6) & 1);
            bVar9 = SUB81(uVar62 >> 7,0);
            auVar126._0_4_ =
                 (uint)(bVar61 & 1) *
                 ((uint)(bVar59 & 1) * auVar94._0_4_ | !(bool)(bVar59 & 1) * uVar69) |
                 !(bool)(bVar61 & 1) * auVar126._0_4_;
            bVar3 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar126._4_4_ =
                 (uint)bVar3 * ((uint)bVar67 * auVar94._4_4_ | !bVar67 * uVar130) |
                 !bVar3 * auVar126._4_4_;
            bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar126._8_4_ =
                 (uint)bVar67 * ((uint)bVar4 * auVar94._8_4_ | !bVar4 * uVar131) |
                 !bVar67 * auVar126._8_4_;
            bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar126._12_4_ =
                 (uint)bVar67 * ((uint)bVar5 * auVar94._12_4_ | !bVar5 * uVar132) |
                 !bVar67 * auVar126._12_4_;
            bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar126._16_4_ =
                 (uint)bVar67 * ((uint)bVar6 * auVar94._16_4_ | !bVar6 * uVar133) |
                 !bVar67 * auVar126._16_4_;
            bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar126._20_4_ =
                 (uint)bVar67 * ((uint)bVar7 * auVar94._20_4_ | !bVar7 * uVar134) |
                 !bVar67 * auVar126._20_4_;
            bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar126._24_4_ =
                 (uint)bVar67 * ((uint)bVar8 * auVar94._24_4_ | !bVar8 * uVar135) |
                 !bVar67 * auVar126._24_4_;
            bVar67 = SUB81(uVar68 >> 7,0);
            auVar126._28_4_ =
                 (uint)bVar67 * ((uint)bVar9 * auVar94._28_4_ | !bVar9 * uVar136) |
                 !bVar67 * auVar126._28_4_;
            bVar64 = (~bVar61 | bVar59) & bVar64;
          }
        }
        auVar229._0_4_ = local_480._0_4_ * auVar226._0_4_;
        auVar229._4_4_ = local_480._4_4_ * auVar226._4_4_;
        auVar229._8_4_ = local_480._8_4_ * auVar226._8_4_;
        auVar229._12_4_ = local_480._12_4_ * auVar226._12_4_;
        auVar229._16_4_ = local_480._16_4_ * auVar226._16_4_;
        auVar229._20_4_ = local_480._20_4_ * auVar226._20_4_;
        auVar229._28_36_ = auVar226._28_36_;
        auVar229._24_4_ = local_480._24_4_ * auVar226._24_4_;
        auVar243 = ZEXT3264(local_460);
        auVar72 = vfmadd231ps_fma(auVar229._0_32_,local_460,auVar84);
        auVar229 = ZEXT3264(local_440);
        auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_440,auVar82);
        auVar225._8_4_ = 0x7fffffff;
        auVar225._0_8_ = 0x7fffffff7fffffff;
        auVar225._12_4_ = 0x7fffffff;
        auVar225._16_4_ = 0x7fffffff;
        auVar225._20_4_ = 0x7fffffff;
        auVar225._24_4_ = 0x7fffffff;
        auVar225._28_4_ = 0x7fffffff;
        auVar226 = ZEXT3264(auVar225);
        auVar94 = vandps_avx(ZEXT1632(auVar72),auVar225);
        auVar237 = ZEXT3264(local_420);
        _local_1c0 = local_420;
        auVar224._8_4_ = 0x3e99999a;
        auVar224._0_8_ = 0x3e99999a3e99999a;
        auVar224._12_4_ = 0x3e99999a;
        auVar224._16_4_ = 0x3e99999a;
        auVar224._20_4_ = 0x3e99999a;
        auVar224._24_4_ = 0x3e99999a;
        auVar224._28_4_ = 0x3e99999a;
        uVar12 = vcmpps_avx512vl(auVar94,auVar224,1);
        _local_360 = vmaxps_avx(local_420,auVar126);
        auVar94 = vminps_avx(local_340,auVar125);
        uVar14 = vcmpps_avx512vl(local_420,auVar94,2);
        bVar61 = (byte)uVar14 & bVar58;
        _local_3e0 = _local_360;
        uVar13 = vcmpps_avx512vl(_local_360,local_340,2);
        if ((bVar58 & ((byte)uVar13 | (byte)uVar14)) == 0) {
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar251 = ZEXT3264(auVar94);
          auVar220 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          local_890 = (uint)(byte)((byte)uVar12 | ~bVar64);
          auVar51._4_4_ = local_480._4_4_ * auVar235._4_4_;
          auVar51._0_4_ = local_480._0_4_ * auVar235._0_4_;
          auVar51._8_4_ = local_480._8_4_ * auVar235._8_4_;
          auVar51._12_4_ = local_480._12_4_ * auVar235._12_4_;
          auVar51._16_4_ = local_480._16_4_ * auVar235._16_4_;
          auVar51._20_4_ = local_480._20_4_ * auVar235._20_4_;
          auVar51._24_4_ = local_480._24_4_ * auVar235._24_4_;
          auVar51._28_4_ = auVar94._28_4_;
          auVar72 = vfmadd213ps_fma(auVar99,local_460,auVar51);
          auVar72 = vfmadd213ps_fma(auVar83,local_440,ZEXT1632(auVar72));
          auVar94 = vandps_avx(ZEXT1632(auVar72),auVar225);
          uVar12 = vcmpps_avx512vl(auVar94,auVar224,1);
          bVar64 = (byte)uVar12 | ~bVar64;
          auVar147._8_4_ = 2;
          auVar147._0_8_ = 0x200000002;
          auVar147._12_4_ = 2;
          auVar147._16_4_ = 2;
          auVar147._20_4_ = 2;
          auVar147._24_4_ = 2;
          auVar147._28_4_ = 2;
          auVar25._8_4_ = 3;
          auVar25._0_8_ = 0x300000003;
          auVar25._12_4_ = 3;
          auVar25._16_4_ = 3;
          auVar25._20_4_ = 3;
          auVar25._24_4_ = 3;
          auVar25._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar147,auVar25);
          local_320._0_4_ = (uint)(bVar64 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
          bVar67 = (bool)(bVar64 >> 1 & 1);
          local_320._4_4_ = (uint)bVar67 * auVar94._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 2 & 1);
          local_320._8_4_ = (uint)bVar67 * auVar94._8_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 3 & 1);
          local_320._12_4_ = (uint)bVar67 * auVar94._12_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 4 & 1);
          local_320._16_4_ = (uint)bVar67 * auVar94._16_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 5 & 1);
          local_320._20_4_ = (uint)bVar67 * auVar94._20_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 6 & 1);
          local_320._24_4_ = (uint)bVar67 * auVar94._24_4_ | (uint)!bVar67 * 2;
          local_320._28_4_ = (uint)(bVar64 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar12 = vpcmpd_avx512vl(local_380,local_320,5);
          local_88c = (uint)bVar61;
          local_3c0 = local_420._0_4_ + (float)local_400._0_4_;
          fStack_3bc = local_420._4_4_ + (float)local_400._4_4_;
          fStack_3b8 = local_420._8_4_ + fStack_3f8;
          fStack_3b4 = local_420._12_4_ + fStack_3f4;
          fStack_3b0 = local_420._16_4_ + fStack_3f0;
          fStack_3ac = local_420._20_4_ + fStack_3ec;
          fStack_3a8 = local_420._24_4_ + fStack_3e8;
          fStack_3a4 = local_420._28_4_ + fStack_3e4;
          for (bVar61 = (byte)uVar12 & bVar61; bVar61 != 0; bVar61 = ~bVar64 & bVar61 & (byte)uVar12
              ) {
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar148,local_420);
            auVar127._0_4_ =
                 (uint)(bVar61 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar61 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar67 * auVar94._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar61 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar67 * auVar94._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar61 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar67 * auVar94._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar61 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar67 * auVar94._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar61 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar67 * auVar94._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar61 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar94 = vminps_avx(auVar127,auVar94);
            auVar83 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar83);
            auVar83 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar83);
            uVar12 = vcmpps_avx512vl(auVar127,auVar94,0);
            bVar59 = (byte)uVar12 & bVar61;
            bVar64 = bVar61;
            if (bVar59 != 0) {
              bVar64 = bVar59;
            }
            iVar15 = 0;
            for (uVar69 = (uint)bVar64; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar64 = '\x01' << ((byte)iVar15 & 0x1f);
            fVar227 = *(float *)(local_1e0 + (uint)(iVar15 << 2));
            auVar229 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
            fVar230 = local_888;
            if ((float)local_700._0_4_ < 0.0) {
              local_7e0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
              auVar226 = ZEXT1664(auVar226._0_16_);
              auVar233 = ZEXT1664(auVar233._0_16_);
              auVar237 = ZEXT1664(auVar237._0_16_);
              auVar243 = ZEXT1664(auVar243._0_16_);
              fVar230 = sqrtf((float)local_700._0_4_);
              auVar229 = ZEXT1664(local_7e0._0_16_);
              auVar249 = ZEXT3264(local_880);
              auVar248 = ZEXT3264(local_860);
              auVar247 = ZEXT3264(local_840);
            }
            uVar68 = (ulong)bVar64;
            auVar73 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar72 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar80 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar74 = vminps_avx(auVar73,auVar80);
            auVar73 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar80 = vmaxps_avx(auVar72,auVar73);
            auVar200._8_4_ = 0x7fffffff;
            auVar200._0_8_ = 0x7fffffff7fffffff;
            auVar200._12_4_ = 0x7fffffff;
            auVar72 = vandps_avx(auVar74,auVar200);
            auVar73 = vandps_avx(auVar80,auVar200);
            auVar72 = vmaxps_avx(auVar72,auVar73);
            auVar73 = vmovshdup_avx(auVar72);
            auVar73 = vmaxss_avx(auVar73,auVar72);
            auVar72 = vshufpd_avx(auVar72,auVar72,1);
            auVar72 = vmaxss_avx(auVar72,auVar73);
            fVar231 = auVar72._0_4_ * 1.9073486e-06;
            local_7c0._0_4_ = fVar230 * 1.9073486e-06;
            local_640 = vshufps_avx(auVar80,auVar80,0xff);
            uVar62 = 0;
            while( true ) {
              auVar72 = ZEXT416((uint)fVar227);
              bVar59 = (byte)uVar68;
              if (uVar62 == 5) break;
              local_7e0._0_16_ = auVar229._0_16_;
              uVar159 = auVar229._0_4_;
              auVar140._4_4_ = uVar159;
              auVar140._0_4_ = uVar159;
              auVar140._8_4_ = uVar159;
              auVar140._12_4_ = uVar159;
              auVar73 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_6f0);
              fVar217 = 1.0 - fVar227;
              fVar207 = fVar217 * fVar217 * fVar217;
              fVar230 = fVar227 * fVar227;
              fVar199 = fVar227 * fVar230;
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar207),
                                        ZEXT416((uint)fVar199));
              fVar232 = fVar227 * fVar217;
              auVar78 = ZEXT416((uint)fVar217);
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar232 * 6.0)),
                                        ZEXT416((uint)(fVar232 * fVar217)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar199),
                                        ZEXT416((uint)fVar207));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar217 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar227 * fVar232)));
              fVar207 = fVar207 * 0.16666667;
              fVar208 = (auVar80._0_4_ + auVar70._0_4_) * 0.16666667;
              fVar209 = (auVar74._0_4_ + auVar79._0_4_) * 0.16666667;
              fVar199 = fVar199 * 0.16666667;
              auVar177._0_4_ = fVar199 * (float)local_6e0._0_4_;
              auVar177._4_4_ = fVar199 * (float)local_6e0._4_4_;
              auVar177._8_4_ = fVar199 * fStack_6d8;
              auVar177._12_4_ = fVar199 * fStack_6d4;
              auVar210._4_4_ = fVar209;
              auVar210._0_4_ = fVar209;
              auVar210._8_4_ = fVar209;
              auVar210._12_4_ = fVar209;
              auVar80 = vfmadd132ps_fma(auVar210,auVar177,local_6a0._0_16_);
              auVar178._4_4_ = fVar208;
              auVar178._0_4_ = fVar208;
              auVar178._8_4_ = fVar208;
              auVar178._12_4_ = fVar208;
              auVar80 = vfmadd132ps_fma(auVar178,auVar80,local_6c0._0_16_);
              auVar160._4_4_ = fVar207;
              auVar160._0_4_ = fVar207;
              auVar160._8_4_ = fVar207;
              auVar160._12_4_ = fVar207;
              auVar80 = vfmadd132ps_fma(auVar160,auVar80,local_680._0_16_);
              local_580._0_16_ = auVar80;
              auVar73 = vsubps_avx(auVar73,auVar80);
              local_720._0_16_ = auVar73;
              auVar73 = vdpps_avx(auVar73,auVar73,0x7f);
              local_740._0_16_ = auVar73;
              if (auVar73._0_4_ < 0.0) {
                local_800._0_4_ = fVar230;
                local_820._0_4_ = fVar232;
                auVar220._0_4_ = sqrtf(auVar73._0_4_);
                auVar220._4_60_ = extraout_var;
                auVar73 = auVar220._0_16_;
                uVar68 = extraout_RAX;
                fVar232 = (float)local_820._0_4_;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                local_800._0_4_ = fVar230;
              }
              local_5a0._4_4_ = fVar217;
              local_5a0._0_4_ = fVar217;
              fStack_598 = fVar217;
              fStack_594 = fVar217;
              auVar74 = vfnmsub213ss_fma(auVar72,auVar72,ZEXT416((uint)(fVar232 * 4.0)));
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * 4.0)),auVar78,auVar78);
              fVar230 = fVar217 * -fVar217 * 0.5;
              fVar232 = auVar74._0_4_ * 0.5;
              fVar207 = auVar80._0_4_ * 0.5;
              local_800._0_4_ = (float)local_800._0_4_ * 0.5;
              auVar201._0_4_ = (float)local_800._0_4_ * (float)local_6e0._0_4_;
              auVar201._4_4_ = (float)local_800._0_4_ * (float)local_6e0._4_4_;
              auVar201._8_4_ = (float)local_800._0_4_ * fStack_6d8;
              auVar201._12_4_ = (float)local_800._0_4_ * fStack_6d4;
              auVar161._4_4_ = fVar207;
              auVar161._0_4_ = fVar207;
              auVar161._8_4_ = fVar207;
              auVar161._12_4_ = fVar207;
              auVar80 = vfmadd132ps_fma(auVar161,auVar201,local_6a0._0_16_);
              auVar179._4_4_ = fVar232;
              auVar179._0_4_ = fVar232;
              auVar179._8_4_ = fVar232;
              auVar179._12_4_ = fVar232;
              auVar80 = vfmadd132ps_fma(auVar179,auVar80,local_6c0._0_16_);
              auVar239._4_4_ = fVar230;
              auVar239._0_4_ = fVar230;
              auVar239._8_4_ = fVar230;
              auVar239._12_4_ = fVar230;
              _local_800 = vfmadd132ps_fma(auVar239,auVar80,local_680._0_16_);
              local_5c0._0_16_ = vdpps_avx(_local_800,_local_800,0x7f);
              auVar53._12_4_ = 0;
              auVar53._0_12_ = ZEXT812(0);
              fVar230 = local_5c0._0_4_;
              local_7b0 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar230));
              fVar232 = local_7b0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar230));
              auVar80 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar80._0_4_;
              local_820._0_4_ = auVar73._0_4_;
              if (fVar230 < -fVar230) {
                auVar226._0_4_ = sqrtf(fVar230);
                auVar226._4_60_ = extraout_var_00;
                auVar73 = ZEXT416((uint)local_820._0_4_);
                auVar74 = auVar226._0_16_;
                uVar68 = extraout_RAX_00;
                auVar80 = _local_800;
              }
              else {
                auVar74 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                auVar80 = _local_800;
              }
              fVar207 = local_7b0._0_4_;
              fVar230 = fVar232 * 1.5 + fVar230 * -0.5 * fVar207 * fVar207 * fVar207;
              local_7b0._0_4_ = auVar80._0_4_ * fVar230;
              local_7b0._4_4_ = auVar80._4_4_ * fVar230;
              local_7b0._8_4_ = auVar80._8_4_ * fVar230;
              local_7b0._12_4_ = auVar80._12_4_ * fVar230;
              auVar70 = vdpps_avx(local_720._0_16_,local_7b0,0x7f);
              fVar208 = auVar73._0_4_;
              fVar232 = auVar70._0_4_;
              auVar141._0_4_ = fVar232 * fVar232;
              auVar141._4_4_ = auVar70._4_4_ * auVar70._4_4_;
              auVar141._8_4_ = auVar70._8_4_ * auVar70._8_4_;
              auVar141._12_4_ = auVar70._12_4_ * auVar70._12_4_;
              auVar79 = vsubps_avx(local_740._0_16_,auVar141);
              fVar207 = auVar79._0_4_;
              auVar162._4_12_ = ZEXT812(0) << 0x20;
              auVar162._0_4_ = fVar207;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
              auVar75 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              if (fVar207 < 0.0) {
                local_610._0_4_ = auVar75._0_4_;
                local_630 = fVar230;
                fStack_62c = fVar230;
                fStack_628 = fVar230;
                fStack_624 = fVar230;
                local_620 = auVar71;
                fVar207 = sqrtf(fVar207);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416((uint)local_610._0_4_);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar73 = ZEXT416((uint)local_820._0_4_);
                uVar68 = extraout_RAX_01;
                auVar80 = _local_800;
                auVar71 = local_620;
                fVar230 = local_630;
                fVar209 = fStack_62c;
                fVar199 = fStack_628;
                fVar217 = fStack_624;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar207 = auVar79._0_4_;
                fVar209 = fVar230;
                fVar199 = fVar230;
                fVar217 = fVar230;
              }
              auVar243 = ZEXT1664(auVar80);
              auVar237 = ZEXT1664(local_740._0_16_);
              auVar233 = ZEXT1664(local_720._0_16_);
              auVar247 = ZEXT3264(local_840);
              auVar248 = ZEXT3264(local_860);
              auVar249 = ZEXT3264(local_880);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar78,auVar72);
              auVar72 = vfmadd231ss_fma(auVar78,auVar72,SUB6416(ZEXT464(0xc0000000),0));
              auVar180._0_4_ = fVar227 * (float)local_6e0._0_4_;
              auVar180._4_4_ = fVar227 * (float)local_6e0._4_4_;
              auVar180._8_4_ = fVar227 * fStack_6d8;
              auVar180._12_4_ = fVar227 * fStack_6d4;
              auVar202._0_4_ = auVar72._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar72 = vfmadd132ps_fma(auVar202,auVar180,local_6a0._0_16_);
              auVar163._0_4_ = auVar79._0_4_;
              auVar163._4_4_ = auVar163._0_4_;
              auVar163._8_4_ = auVar163._0_4_;
              auVar163._12_4_ = auVar163._0_4_;
              auVar72 = vfmadd132ps_fma(auVar163,auVar72,local_6c0._0_16_);
              auVar72 = vfmadd132ps_fma(_local_5a0,auVar72,local_680._0_16_);
              auVar164._0_4_ = auVar72._0_4_ * (float)local_5c0._0_4_;
              auVar164._4_4_ = auVar72._4_4_ * (float)local_5c0._0_4_;
              auVar164._8_4_ = auVar72._8_4_ * (float)local_5c0._0_4_;
              auVar164._12_4_ = auVar72._12_4_ * (float)local_5c0._0_4_;
              auVar72 = vdpps_avx(auVar80,auVar72,0x7f);
              fVar176 = auVar72._0_4_;
              auVar181._0_4_ = auVar80._0_4_ * fVar176;
              auVar181._4_4_ = auVar80._4_4_ * fVar176;
              auVar181._8_4_ = auVar80._8_4_ * fVar176;
              auVar181._12_4_ = auVar80._12_4_ * fVar176;
              auVar72 = vsubps_avx(auVar164,auVar181);
              fVar176 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar16._8_4_ = 0x80000000;
              auVar16._0_8_ = 0x8000000080000000;
              auVar16._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar80,auVar16);
              auVar211._0_4_ = fVar230 * auVar72._0_4_ * fVar176;
              auVar211._4_4_ = fVar209 * auVar72._4_4_ * fVar176;
              auVar211._8_4_ = fVar199 * auVar72._8_4_ * fVar176;
              auVar211._12_4_ = fVar217 * auVar72._12_4_ * fVar176;
              auVar72 = vdpps_avx(auVar77,local_7b0,0x7f);
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar231),
                                   ZEXT416((uint)((float)local_7e0._0_4_ * (float)local_7c0._0_4_)))
              ;
              auVar78 = vdivss_avx512f(ZEXT416((uint)fVar231),auVar74);
              auVar74 = vdpps_avx(local_720._0_16_,auVar211,0x7f);
              auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar231),auVar79);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 + 1.0)),auVar78,auVar73);
              auVar73 = vdpps_avx(local_6f0,local_7b0,0x7f);
              fVar230 = auVar72._0_4_ + auVar74._0_4_;
              auVar72 = vdpps_avx(local_720._0_16_,auVar77,0x7f);
              auVar76 = vmulss_avx512f(auVar76,auVar71);
              auVar71 = vmulss_avx512f(auVar71,auVar71);
              auVar74 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar76._0_4_ * auVar71._0_4_)));
              auVar71 = vfnmadd231ss_fma(auVar72,auVar70,ZEXT416((uint)fVar230));
              auVar75 = vfnmadd231ss_fma(auVar74,auVar70,auVar73);
              auVar72 = vpermilps_avx(local_580._0_16_,0xff);
              fVar207 = fVar207 - auVar72._0_4_;
              auVar72 = vshufps_avx(auVar80,auVar80,0xff);
              auVar74 = vfmsub213ss_fma(auVar71,auVar76,auVar72);
              fVar208 = auVar75._0_4_ * auVar76._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar230),ZEXT416((uint)fVar208));
              auVar226 = ZEXT1664(auVar71);
              fVar209 = auVar71._0_4_;
              fVar227 = fVar227 - (fVar232 * (fVar208 / fVar209) -
                                  fVar207 * (auVar73._0_4_ / fVar209));
              fVar230 = (float)local_7e0._0_4_ -
                        (fVar207 * (fVar230 / fVar209) - fVar232 * (auVar74._0_4_ / fVar209));
              auVar229 = ZEXT464((uint)fVar230);
              auVar17._8_4_ = 0x7fffffff;
              auVar17._0_8_ = 0x7fffffff7fffffff;
              auVar17._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(auVar70,auVar17);
              if (auVar73._0_4_ < auVar78._0_4_) {
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar79._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar18._8_4_ = 0x7fffffff;
                auVar18._0_8_ = 0x7fffffff7fffffff;
                auVar18._12_4_ = 0x7fffffff;
                auVar74 = vandps_avx512vl(ZEXT416((uint)fVar207),auVar18);
                if (auVar74._0_4_ < auVar73._0_4_) {
                  bVar67 = uVar62 < 5;
                  fVar231 = fVar230 + (float)local_650._0_4_;
                  if ((fVar137 <= fVar231) &&
                     (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar231 <= fVar232)) {
                    bVar59 = 0;
                    if ((fVar227 < 0.0) || (1.0 < fVar227)) goto LAB_019d784b;
                    auVar182._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar182._0_4_ = local_740._0_4_;
                    auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar182);
                    fVar207 = auVar73._0_4_;
                    pGVar1 = (context->scene->geometries).items[local_778].ptr;
                    if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar59 = 1, pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019d784b;
                      fVar207 = fVar207 * 1.5 + local_740._0_4_ * -0.5 * fVar207 * fVar207 * fVar207
                      ;
                      auVar183._0_4_ = local_720._0_4_ * fVar207;
                      auVar183._4_4_ = local_720._4_4_ * fVar207;
                      auVar183._8_4_ = local_720._8_4_ * fVar207;
                      auVar183._12_4_ = local_720._12_4_ * fVar207;
                      auVar70 = vfmadd213ps_fma(auVar72,auVar183,auVar80);
                      auVar72 = vshufps_avx(auVar183,auVar183,0xc9);
                      auVar73 = vshufps_avx(auVar80,auVar80,0xc9);
                      auVar184._0_4_ = auVar183._0_4_ * auVar73._0_4_;
                      auVar184._4_4_ = auVar183._4_4_ * auVar73._4_4_;
                      auVar184._8_4_ = auVar183._8_4_ * auVar73._8_4_;
                      auVar184._12_4_ = auVar183._12_4_ * auVar73._12_4_;
                      auVar74 = vfmsub231ps_fma(auVar184,auVar80,auVar72);
                      auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar73 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                      auVar142._0_4_ = auVar70._0_4_ * auVar74._0_4_;
                      auVar142._4_4_ = auVar70._4_4_ * auVar74._4_4_;
                      auVar142._8_4_ = auVar70._8_4_ * auVar74._8_4_;
                      auVar142._12_4_ = auVar70._12_4_ * auVar74._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar142,auVar72,auVar73);
                      local_520 = (RTCHitN  [16])vshufps_avx(auVar72,auVar72,0x55);
                      auStack_510 = vshufps_avx(auVar72,auVar72,0xaa);
                      local_500 = auVar72._0_4_;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      local_4f0 = fVar227;
                      fStack_4ec = fVar227;
                      fStack_4e8 = fVar227;
                      fStack_4e4 = fVar227;
                      local_4e0 = ZEXT416(0) << 0x20;
                      local_4d0 = local_530._0_8_;
                      uStack_4c8 = local_530._8_8_;
                      local_4c0 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_4ac = context->user->instID[0];
                      local_4b0 = uStack_4ac;
                      uStack_4a8 = uStack_4ac;
                      uStack_4a4 = uStack_4ac;
                      uStack_4a0 = context->user->instPrimID[0];
                      uStack_49c = uStack_4a0;
                      uStack_498 = uStack_4a0;
                      uStack_494 = uStack_4a0;
                      *(float *)(ray + k * 4 + 0x80) = fVar231;
                      local_8a0 = local_550;
                      local_770.valid = (int *)local_8a0;
                      local_770.geometryUserPtr = pGVar1->userPtr;
                      local_770.context = context->user;
                      local_770.hit = local_520;
                      local_770.N = 4;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar226 = ZEXT1664(auVar71);
                        auVar229 = ZEXT464((uint)fVar230);
                        auVar233 = ZEXT1664(local_720._0_16_);
                        auVar237 = ZEXT1664(local_740._0_16_);
                        auVar243 = ZEXT1664(auVar80);
                        (*pGVar1->occlusionFilterN)(&local_770);
                        auVar249 = ZEXT3264(local_880);
                        auVar248 = ZEXT3264(local_860);
                        auVar247 = ZEXT3264(local_840);
                      }
                      uVar68 = vptestmd_avx512vl(local_8a0,local_8a0);
                      if ((uVar68 & 0xf) != 0) {
                        p_Var2 = context->args->filter;
                        if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar226 = ZEXT1664(auVar226._0_16_);
                          auVar229 = ZEXT1664(auVar229._0_16_);
                          auVar233 = ZEXT1664(auVar233._0_16_);
                          auVar237 = ZEXT1664(auVar237._0_16_);
                          auVar243 = ZEXT1664(auVar243._0_16_);
                          (*p_Var2)(&local_770);
                          auVar249 = ZEXT3264(local_880);
                          auVar248 = ZEXT3264(local_860);
                          auVar247 = ZEXT3264(local_840);
                        }
                        uVar68 = vptestmd_avx512vl(local_8a0,local_8a0);
                        uVar68 = uVar68 & 0xf;
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar3 = (bool)((byte)uVar68 & 1);
                        bVar4 = (bool)((byte)(uVar68 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar68 >> 2) & 1);
                        bVar6 = SUB81(uVar68 >> 3,0);
                        *(uint *)(local_770.ray + 0x80) =
                             (uint)bVar3 * auVar72._0_4_ |
                             (uint)!bVar3 * *(int *)(local_770.ray + 0x80);
                        *(uint *)(local_770.ray + 0x84) =
                             (uint)bVar4 * auVar72._4_4_ |
                             (uint)!bVar4 * *(int *)(local_770.ray + 0x84);
                        *(uint *)(local_770.ray + 0x88) =
                             (uint)bVar5 * auVar72._8_4_ |
                             (uint)!bVar5 * *(int *)(local_770.ray + 0x88);
                        *(uint *)(local_770.ray + 0x8c) =
                             (uint)bVar6 * auVar72._12_4_ |
                             (uint)!bVar6 * *(int *)(local_770.ray + 0x8c);
                        bVar59 = 1;
                        if ((byte)uVar68 != 0) goto LAB_019d784b;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar232;
                    }
                  }
                  bVar59 = 0;
                  goto LAB_019d784b;
                }
              }
              uVar62 = uVar62 + 1;
            }
            bVar67 = false;
LAB_019d784b:
            bVar66 = bVar66 | bVar67 & bVar59;
            uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar218._4_4_ = uVar159;
            auVar218._0_4_ = uVar159;
            auVar218._8_4_ = uVar159;
            auVar218._12_4_ = uVar159;
            auVar218._16_4_ = uVar159;
            auVar218._20_4_ = uVar159;
            auVar218._24_4_ = uVar159;
            auVar218._28_4_ = uVar159;
            auVar220 = ZEXT3264(auVar218);
            auVar55._4_4_ = fStack_3bc;
            auVar55._0_4_ = local_3c0;
            auVar55._8_4_ = fStack_3b8;
            auVar55._12_4_ = fStack_3b4;
            auVar55._16_4_ = fStack_3b0;
            auVar55._20_4_ = fStack_3ac;
            auVar55._24_4_ = fStack_3a8;
            auVar55._28_4_ = fStack_3a4;
            uVar12 = vcmpps_avx512vl(auVar218,auVar55,0xd);
          }
          auVar149._0_4_ = (float)local_400._0_4_ + (float)local_3e0._0_4_;
          auVar149._4_4_ = (float)local_400._4_4_ + (float)local_3e0._4_4_;
          auVar149._8_4_ = fStack_3f8 + fStack_3d8;
          auVar149._12_4_ = fStack_3f4 + fStack_3d4;
          auVar149._16_4_ = fStack_3f0 + fStack_3d0;
          auVar149._20_4_ = fStack_3ec + fStack_3cc;
          auVar149._24_4_ = fStack_3e8 + fStack_3c8;
          auVar149._28_4_ = fStack_3e4 + fStack_3c4;
          uVar159 = auVar220._0_4_;
          auVar171._4_4_ = uVar159;
          auVar171._0_4_ = uVar159;
          auVar171._8_4_ = uVar159;
          auVar171._12_4_ = uVar159;
          auVar171._16_4_ = uVar159;
          auVar171._20_4_ = uVar159;
          auVar171._24_4_ = uVar159;
          auVar171._28_4_ = uVar159;
          uVar12 = vcmpps_avx512vl(auVar149,auVar171,2);
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar26._8_4_ = 3;
          auVar26._0_8_ = 0x300000003;
          auVar26._12_4_ = 3;
          auVar26._16_4_ = 3;
          auVar26._20_4_ = 3;
          auVar26._24_4_ = 3;
          auVar26._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar150,auVar26);
          bVar67 = (bool)((byte)local_890 & 1);
          local_3e0._0_4_ = (uint)bVar67 * auVar94._0_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)((byte)(local_890 >> 1) & 1);
          local_3e0._4_4_ = (uint)bVar67 * auVar94._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)((byte)(local_890 >> 2) & 1);
          fStack_3d8 = (float)((uint)bVar67 * auVar94._8_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_890 >> 3) & 1);
          fStack_3d4 = (float)((uint)bVar67 * auVar94._12_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_890 >> 4) & 1);
          fStack_3d0 = (float)((uint)bVar67 * auVar94._16_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_890 >> 5) & 1);
          fStack_3cc = (float)((uint)bVar67 * auVar94._20_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_890 >> 6) & 1);
          fStack_3c8 = (float)((uint)bVar67 * auVar94._24_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_890 >> 7) & 1);
          fStack_3c4 = (float)((uint)bVar67 * auVar94._28_4_ | (uint)!bVar67 * 2);
          bVar58 = (byte)uVar13 & bVar58 & (byte)uVar12;
          uVar12 = vpcmpd_avx512vl(_local_3e0,local_380,2);
          local_420 = _local_360;
          local_3c0 = (float)local_400._0_4_ + (float)local_360._0_4_;
          fStack_3bc = (float)local_400._4_4_ + (float)local_360._4_4_;
          fStack_3b8 = fStack_3f8 + fStack_358;
          fStack_3b4 = fStack_3f4 + fStack_354;
          fStack_3b0 = fStack_3f0 + fStack_350;
          fStack_3ac = fStack_3ec + fStack_34c;
          fStack_3a8 = fStack_3e8 + fStack_348;
          fStack_3a4 = fStack_3e4 + fStack_344;
          for (bVar64 = (byte)uVar12 & bVar58; bVar64 != 0; bVar64 = ~bVar61 & bVar64 & (byte)uVar12
              ) {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar151,local_420);
            auVar128._0_4_ =
                 (uint)(bVar64 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            auVar128._4_4_ = (uint)bVar67 * auVar94._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 2 & 1);
            auVar128._8_4_ = (uint)bVar67 * auVar94._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 3 & 1);
            auVar128._12_4_ = (uint)bVar67 * auVar94._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 4 & 1);
            auVar128._16_4_ = (uint)bVar67 * auVar94._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 5 & 1);
            auVar128._20_4_ = (uint)bVar67 * auVar94._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar128._24_4_ =
                 (uint)(bVar64 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar128,auVar128,0xb1);
            auVar94 = vminps_avx(auVar128,auVar94);
            auVar83 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar83);
            auVar83 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar83);
            uVar12 = vcmpps_avx512vl(auVar128,auVar94,0);
            bVar59 = (byte)uVar12 & bVar64;
            bVar61 = bVar64;
            if (bVar59 != 0) {
              bVar61 = bVar59;
            }
            iVar15 = 0;
            for (uVar69 = (uint)bVar61; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar61 = '\x01' << ((byte)iVar15 & 0x1f);
            fVar227 = *(float *)(local_200 + (uint)(iVar15 << 2));
            auVar229 = ZEXT464(*(uint *)(local_340 + (uint)(iVar15 << 2)));
            fVar230 = local_884;
            if ((float)local_700._0_4_ < 0.0) {
              local_7e0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar15 << 2)));
              auVar226 = ZEXT1664(auVar226._0_16_);
              auVar233 = ZEXT1664(auVar233._0_16_);
              auVar237 = ZEXT1664(auVar237._0_16_);
              auVar243 = ZEXT1664(auVar243._0_16_);
              fVar230 = sqrtf((float)local_700._0_4_);
              auVar229 = ZEXT1664(local_7e0._0_16_);
              auVar249 = ZEXT3264(local_880);
              auVar248 = ZEXT3264(local_860);
              auVar247 = ZEXT3264(local_840);
            }
            uVar68 = (ulong)bVar61;
            auVar73 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar72 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar80 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar74 = vminps_avx(auVar73,auVar80);
            auVar73 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar80 = vmaxps_avx(auVar72,auVar73);
            auVar203._8_4_ = 0x7fffffff;
            auVar203._0_8_ = 0x7fffffff7fffffff;
            auVar203._12_4_ = 0x7fffffff;
            auVar72 = vandps_avx(auVar74,auVar203);
            auVar73 = vandps_avx(auVar80,auVar203);
            auVar72 = vmaxps_avx(auVar72,auVar73);
            auVar73 = vmovshdup_avx(auVar72);
            auVar73 = vmaxss_avx(auVar73,auVar72);
            auVar72 = vshufpd_avx(auVar72,auVar72,1);
            auVar72 = vmaxss_avx(auVar72,auVar73);
            local_7b0._0_4_ = auVar72._0_4_ * 1.9073486e-06;
            local_640 = vshufps_avx(auVar80,auVar80,0xff);
            uVar62 = 0;
            while( true ) {
              auVar72 = ZEXT416((uint)fVar227);
              bVar59 = (byte)uVar68;
              if (uVar62 == 5) break;
              local_7e0._0_16_ = auVar229._0_16_;
              uVar159 = auVar229._0_4_;
              auVar143._4_4_ = uVar159;
              auVar143._0_4_ = uVar159;
              auVar143._8_4_ = uVar159;
              auVar143._12_4_ = uVar159;
              auVar73 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_6f0);
              fVar217 = 1.0 - fVar227;
              fVar207 = fVar217 * fVar217 * fVar217;
              fVar231 = fVar227 * fVar227;
              fVar199 = fVar227 * fVar231;
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar207),
                                        ZEXT416((uint)fVar199));
              fVar232 = fVar227 * fVar217;
              auVar78 = ZEXT416((uint)fVar217);
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar232 * 6.0)),
                                        ZEXT416((uint)(fVar232 * fVar217)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar199),
                                        ZEXT416((uint)fVar207));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar217 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar227 * fVar232)));
              fVar207 = fVar207 * 0.16666667;
              fVar208 = (auVar80._0_4_ + auVar70._0_4_) * 0.16666667;
              fVar209 = (auVar74._0_4_ + auVar79._0_4_) * 0.16666667;
              fVar199 = fVar199 * 0.16666667;
              auVar185._0_4_ = fVar199 * (float)local_6e0._0_4_;
              auVar185._4_4_ = fVar199 * (float)local_6e0._4_4_;
              auVar185._8_4_ = fVar199 * fStack_6d8;
              auVar185._12_4_ = fVar199 * fStack_6d4;
              auVar212._4_4_ = fVar209;
              auVar212._0_4_ = fVar209;
              auVar212._8_4_ = fVar209;
              auVar212._12_4_ = fVar209;
              auVar80 = vfmadd132ps_fma(auVar212,auVar185,local_6a0._0_16_);
              auVar186._4_4_ = fVar208;
              auVar186._0_4_ = fVar208;
              auVar186._8_4_ = fVar208;
              auVar186._12_4_ = fVar208;
              auVar80 = vfmadd132ps_fma(auVar186,auVar80,local_6c0._0_16_);
              auVar165._4_4_ = fVar207;
              auVar165._0_4_ = fVar207;
              auVar165._8_4_ = fVar207;
              auVar165._12_4_ = fVar207;
              auVar80 = vfmadd132ps_fma(auVar165,auVar80,local_680._0_16_);
              local_580._0_16_ = auVar80;
              auVar73 = vsubps_avx(auVar73,auVar80);
              local_720._0_16_ = auVar73;
              auVar73 = vdpps_avx(auVar73,auVar73,0x7f);
              local_740._0_16_ = auVar73;
              if (auVar73._0_4_ < 0.0) {
                local_800._0_4_ = fVar231;
                local_820._0_4_ = fVar232;
                auVar233._0_4_ = sqrtf(auVar73._0_4_);
                auVar233._4_60_ = extraout_var_01;
                auVar73 = auVar233._0_16_;
                uVar68 = extraout_RAX_02;
                fVar232 = (float)local_820._0_4_;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                local_800._0_4_ = fVar231;
              }
              local_5a0._4_4_ = fVar217;
              local_5a0._0_4_ = fVar217;
              fStack_598 = fVar217;
              fStack_594 = fVar217;
              auVar74 = vfnmsub213ss_fma(auVar72,auVar72,ZEXT416((uint)(fVar232 * 4.0)));
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * 4.0)),auVar78,auVar78);
              fVar231 = fVar217 * -fVar217 * 0.5;
              fVar232 = auVar74._0_4_ * 0.5;
              fVar207 = auVar80._0_4_ * 0.5;
              local_800._0_4_ = (float)local_800._0_4_ * 0.5;
              auVar204._0_4_ = (float)local_800._0_4_ * (float)local_6e0._0_4_;
              auVar204._4_4_ = (float)local_800._0_4_ * (float)local_6e0._4_4_;
              auVar204._8_4_ = (float)local_800._0_4_ * fStack_6d8;
              auVar204._12_4_ = (float)local_800._0_4_ * fStack_6d4;
              auVar166._4_4_ = fVar207;
              auVar166._0_4_ = fVar207;
              auVar166._8_4_ = fVar207;
              auVar166._12_4_ = fVar207;
              auVar80 = vfmadd132ps_fma(auVar166,auVar204,local_6a0._0_16_);
              auVar187._4_4_ = fVar232;
              auVar187._0_4_ = fVar232;
              auVar187._8_4_ = fVar232;
              auVar187._12_4_ = fVar232;
              auVar80 = vfmadd132ps_fma(auVar187,auVar80,local_6c0._0_16_);
              auVar240._4_4_ = fVar231;
              auVar240._0_4_ = fVar231;
              auVar240._8_4_ = fVar231;
              auVar240._12_4_ = fVar231;
              _local_800 = vfmadd132ps_fma(auVar240,auVar80,local_680._0_16_);
              local_5c0._0_16_ = vdpps_avx(_local_800,_local_800,0x7f);
              auVar54._12_4_ = 0;
              auVar54._0_12_ = ZEXT812(0);
              fVar231 = local_5c0._0_4_;
              auVar74 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar231));
              local_5e0._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar231));
              auVar80 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar80._0_4_;
              local_820._0_4_ = auVar73._0_4_;
              if (fVar231 < -fVar231) {
                local_7c0 = auVar74;
                auVar237._0_4_ = sqrtf(fVar231);
                auVar237._4_60_ = extraout_var_02;
                auVar73 = ZEXT416((uint)local_820._0_4_);
                auVar79 = auVar237._0_16_;
                uVar68 = extraout_RAX_03;
                auVar80 = local_7c0;
                auVar70 = _local_800;
              }
              else {
                auVar79 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                auVar80 = auVar74;
                auVar70 = _local_800;
              }
              fVar232 = auVar80._0_4_;
              fVar231 = auVar74._0_4_ * 1.5 + fVar231 * -0.5 * fVar232 * fVar232 * fVar232;
              auVar246._0_4_ = auVar70._0_4_ * fVar231;
              auVar246._4_4_ = auVar70._4_4_ * fVar231;
              auVar246._8_4_ = auVar70._8_4_ * fVar231;
              auVar246._12_4_ = auVar70._12_4_ * fVar231;
              auVar80 = vdpps_avx(local_720._0_16_,auVar246,0x7f);
              fVar232 = auVar73._0_4_ + 1.0;
              fVar207 = auVar80._0_4_;
              auVar144._0_4_ = fVar207 * fVar207;
              auVar144._4_4_ = auVar80._4_4_ * auVar80._4_4_;
              auVar144._8_4_ = auVar80._8_4_ * auVar80._8_4_;
              auVar144._12_4_ = auVar80._12_4_ * auVar80._12_4_;
              auVar74 = vsubps_avx(local_740._0_16_,auVar144);
              fVar208 = auVar74._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar208;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar75 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
              if (fVar208 < 0.0) {
                local_7c0._0_4_ = fVar232;
                local_630 = fVar231;
                fStack_62c = fVar231;
                fStack_628 = fVar231;
                fStack_624 = fVar231;
                local_620 = auVar246;
                local_610 = auVar71;
                fVar208 = sqrtf(fVar208);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar73 = ZEXT416((uint)local_820._0_4_);
                uVar68 = extraout_RAX_04;
                auVar70 = _local_800;
                fVar232 = (float)local_7c0._0_4_;
                auVar246 = local_620;
                auVar71 = local_610;
                fVar231 = local_630;
                fVar209 = fStack_62c;
                fVar199 = fStack_628;
                fVar217 = fStack_624;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
                fVar208 = auVar74._0_4_;
                fVar209 = fVar231;
                fVar199 = fVar231;
                fVar217 = fVar231;
              }
              auVar243 = ZEXT1664(auVar70);
              auVar237 = ZEXT1664(local_740._0_16_);
              auVar233 = ZEXT1664(local_720._0_16_);
              auVar247 = ZEXT3264(local_840);
              auVar248 = ZEXT3264(local_860);
              auVar249 = ZEXT3264(local_880);
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar78,auVar72);
              auVar72 = vfmadd231ss_fma(auVar78,auVar72,SUB6416(ZEXT464(0xc0000000),0));
              auVar188._0_4_ = fVar227 * (float)local_6e0._0_4_;
              auVar188._4_4_ = fVar227 * (float)local_6e0._4_4_;
              auVar188._8_4_ = fVar227 * fStack_6d8;
              auVar188._12_4_ = fVar227 * fStack_6d4;
              auVar205._0_4_ = auVar72._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar72 = vfmadd132ps_fma(auVar205,auVar188,local_6a0._0_16_);
              auVar168._0_4_ = auVar74._0_4_;
              auVar168._4_4_ = auVar168._0_4_;
              auVar168._8_4_ = auVar168._0_4_;
              auVar168._12_4_ = auVar168._0_4_;
              auVar72 = vfmadd132ps_fma(auVar168,auVar72,local_6c0._0_16_);
              auVar72 = vfmadd132ps_fma(_local_5a0,auVar72,local_680._0_16_);
              auVar169._0_4_ = auVar72._0_4_ * (float)local_5c0._0_4_;
              auVar169._4_4_ = auVar72._4_4_ * (float)local_5c0._0_4_;
              auVar169._8_4_ = auVar72._8_4_ * (float)local_5c0._0_4_;
              auVar169._12_4_ = auVar72._12_4_ * (float)local_5c0._0_4_;
              auVar72 = vdpps_avx(auVar70,auVar72,0x7f);
              fVar176 = auVar72._0_4_;
              auVar189._0_4_ = auVar70._0_4_ * fVar176;
              auVar189._4_4_ = auVar70._4_4_ * fVar176;
              auVar189._8_4_ = auVar70._8_4_ * fVar176;
              auVar189._12_4_ = auVar70._12_4_ * fVar176;
              auVar72 = vsubps_avx(auVar169,auVar189);
              fVar176 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar70,auVar19);
              auVar213._0_4_ = fVar231 * auVar72._0_4_ * fVar176;
              auVar213._4_4_ = fVar209 * auVar72._4_4_ * fVar176;
              auVar213._8_4_ = fVar199 * auVar72._8_4_ * fVar176;
              auVar213._12_4_ = fVar217 * auVar72._12_4_ * fVar176;
              auVar72 = vdpps_avx(auVar77,auVar246,0x7f);
              auVar78 = vmaxss_avx(ZEXT416((uint)local_7b0._0_4_),
                                   ZEXT416((uint)((float)local_7e0._0_4_ * fVar230 * 1.9073486e-06))
                                  );
              auVar79 = vdivss_avx512f(ZEXT416((uint)local_7b0._0_4_),auVar79);
              auVar74 = vdpps_avx(local_720._0_16_,auVar213,0x7f);
              auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)local_7b0._0_4_),auVar78);
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar232),auVar79,auVar73);
              auVar73 = vdpps_avx(local_6f0,auVar246,0x7f);
              fVar231 = auVar72._0_4_ + auVar74._0_4_;
              auVar72 = vdpps_avx(local_720._0_16_,auVar77,0x7f);
              auVar76 = vmulss_avx512f(auVar76,auVar71);
              auVar71 = vmulss_avx512f(auVar71,auVar71);
              auVar74 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar76._0_4_ * auVar71._0_4_)));
              auVar71 = vfnmadd231ss_fma(auVar72,auVar80,ZEXT416((uint)fVar231));
              auVar75 = vfnmadd231ss_fma(auVar74,auVar80,auVar73);
              auVar72 = vpermilps_avx(local_580._0_16_,0xff);
              fVar208 = fVar208 - auVar72._0_4_;
              auVar72 = vshufps_avx(auVar70,auVar70,0xff);
              auVar74 = vfmsub213ss_fma(auVar71,auVar76,auVar72);
              fVar232 = auVar75._0_4_ * auVar76._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar231),ZEXT416((uint)fVar232));
              auVar226 = ZEXT1664(auVar71);
              fVar209 = auVar71._0_4_;
              fVar227 = fVar227 - (fVar207 * (fVar232 / fVar209) -
                                  fVar208 * (auVar73._0_4_ / fVar209));
              fVar231 = (float)local_7e0._0_4_ -
                        (fVar208 * (fVar231 / fVar209) - fVar207 * (auVar74._0_4_ / fVar209));
              auVar229 = ZEXT464((uint)fVar231);
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(auVar80,auVar20);
              if (auVar73._0_4_ < auVar79._0_4_) {
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ + auVar78._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar80 = vandps_avx512vl(ZEXT416((uint)fVar208),auVar21);
                if (auVar80._0_4_ < auVar73._0_4_) {
                  bVar67 = uVar62 < 5;
                  fVar230 = fVar231 + (float)local_650._0_4_;
                  if ((fVar137 <= fVar230) &&
                     (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar230 <= fVar232)) {
                    bVar59 = 0;
                    if ((fVar227 < 0.0) || (1.0 < fVar227)) goto LAB_019d8451;
                    auVar190._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar190._0_4_ = local_740._0_4_;
                    auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar190);
                    fVar207 = auVar73._0_4_;
                    pGVar1 = (context->scene->geometries).items[local_778].ptr;
                    if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar59 = 1, pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019d8451;
                      fVar207 = fVar207 * 1.5 + local_740._0_4_ * -0.5 * fVar207 * fVar207 * fVar207
                      ;
                      auVar191._0_4_ = local_720._0_4_ * fVar207;
                      auVar191._4_4_ = local_720._4_4_ * fVar207;
                      auVar191._8_4_ = local_720._8_4_ * fVar207;
                      auVar191._12_4_ = local_720._12_4_ * fVar207;
                      auVar74 = vfmadd213ps_fma(auVar72,auVar191,auVar70);
                      auVar72 = vshufps_avx(auVar191,auVar191,0xc9);
                      auVar73 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar192._0_4_ = auVar191._0_4_ * auVar73._0_4_;
                      auVar192._4_4_ = auVar191._4_4_ * auVar73._4_4_;
                      auVar192._8_4_ = auVar191._8_4_ * auVar73._8_4_;
                      auVar192._12_4_ = auVar191._12_4_ * auVar73._12_4_;
                      auVar80 = vfmsub231ps_fma(auVar192,auVar70,auVar72);
                      auVar72 = vshufps_avx(auVar80,auVar80,0xc9);
                      auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                      auVar145._0_4_ = auVar74._0_4_ * auVar80._0_4_;
                      auVar145._4_4_ = auVar74._4_4_ * auVar80._4_4_;
                      auVar145._8_4_ = auVar74._8_4_ * auVar80._8_4_;
                      auVar145._12_4_ = auVar74._12_4_ * auVar80._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar145,auVar72,auVar73);
                      local_520 = (RTCHitN  [16])vshufps_avx(auVar72,auVar72,0x55);
                      auStack_510 = vshufps_avx(auVar72,auVar72,0xaa);
                      local_500 = auVar72._0_4_;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      local_4f0 = fVar227;
                      fStack_4ec = fVar227;
                      fStack_4e8 = fVar227;
                      fStack_4e4 = fVar227;
                      local_4e0 = ZEXT416(0) << 0x20;
                      local_4d0 = local_530._0_8_;
                      uStack_4c8 = local_530._8_8_;
                      local_4c0 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_4ac = context->user->instID[0];
                      local_4b0 = uStack_4ac;
                      uStack_4a8 = uStack_4ac;
                      uStack_4a4 = uStack_4ac;
                      uStack_4a0 = context->user->instPrimID[0];
                      uStack_49c = uStack_4a0;
                      uStack_498 = uStack_4a0;
                      uStack_494 = uStack_4a0;
                      *(float *)(ray + k * 4 + 0x80) = fVar230;
                      local_8a0 = local_550;
                      local_770.valid = (int *)local_8a0;
                      local_770.geometryUserPtr = pGVar1->userPtr;
                      local_770.context = context->user;
                      local_770.hit = local_520;
                      local_770.N = 4;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar226 = ZEXT1664(auVar71);
                        auVar229 = ZEXT464((uint)fVar231);
                        auVar233 = ZEXT1664(local_720._0_16_);
                        auVar237 = ZEXT1664(local_740._0_16_);
                        auVar243 = ZEXT1664(auVar70);
                        (*pGVar1->occlusionFilterN)(&local_770);
                        auVar249 = ZEXT3264(local_880);
                        auVar248 = ZEXT3264(local_860);
                        auVar247 = ZEXT3264(local_840);
                      }
                      uVar68 = vptestmd_avx512vl(local_8a0,local_8a0);
                      if ((uVar68 & 0xf) != 0) {
                        p_Var2 = context->args->filter;
                        if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar226 = ZEXT1664(auVar226._0_16_);
                          auVar229 = ZEXT1664(auVar229._0_16_);
                          auVar233 = ZEXT1664(auVar233._0_16_);
                          auVar237 = ZEXT1664(auVar237._0_16_);
                          auVar243 = ZEXT1664(auVar243._0_16_);
                          (*p_Var2)(&local_770);
                          auVar249 = ZEXT3264(local_880);
                          auVar248 = ZEXT3264(local_860);
                          auVar247 = ZEXT3264(local_840);
                        }
                        uVar68 = vptestmd_avx512vl(local_8a0,local_8a0);
                        uVar68 = uVar68 & 0xf;
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar3 = (bool)((byte)uVar68 & 1);
                        bVar4 = (bool)((byte)(uVar68 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar68 >> 2) & 1);
                        bVar6 = SUB81(uVar68 >> 3,0);
                        *(uint *)(local_770.ray + 0x80) =
                             (uint)bVar3 * auVar72._0_4_ |
                             (uint)!bVar3 * *(int *)(local_770.ray + 0x80);
                        *(uint *)(local_770.ray + 0x84) =
                             (uint)bVar4 * auVar72._4_4_ |
                             (uint)!bVar4 * *(int *)(local_770.ray + 0x84);
                        *(uint *)(local_770.ray + 0x88) =
                             (uint)bVar5 * auVar72._8_4_ |
                             (uint)!bVar5 * *(int *)(local_770.ray + 0x88);
                        *(uint *)(local_770.ray + 0x8c) =
                             (uint)bVar6 * auVar72._12_4_ |
                             (uint)!bVar6 * *(int *)(local_770.ray + 0x8c);
                        bVar59 = 1;
                        if ((byte)uVar68 != 0) goto LAB_019d8451;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar232;
                    }
                  }
                  bVar59 = 0;
                  goto LAB_019d8451;
                }
              }
              uVar62 = uVar62 + 1;
            }
            bVar67 = false;
LAB_019d8451:
            bVar66 = bVar66 | bVar67 & bVar59;
            uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar219._4_4_ = uVar159;
            auVar219._0_4_ = uVar159;
            auVar219._8_4_ = uVar159;
            auVar219._12_4_ = uVar159;
            auVar219._16_4_ = uVar159;
            auVar219._20_4_ = uVar159;
            auVar219._24_4_ = uVar159;
            auVar219._28_4_ = uVar159;
            auVar220 = ZEXT3264(auVar219);
            auVar56._4_4_ = fStack_3bc;
            auVar56._0_4_ = local_3c0;
            auVar56._8_4_ = fStack_3b8;
            auVar56._12_4_ = fStack_3b4;
            auVar56._16_4_ = fStack_3b0;
            auVar56._20_4_ = fStack_3ac;
            auVar56._24_4_ = fStack_3a8;
            auVar56._28_4_ = fStack_3a4;
            uVar12 = vcmpps_avx512vl(auVar219,auVar56,0xd);
          }
          uVar14 = vpcmpd_avx512vl(local_380,local_320,1);
          uVar13 = vpcmpd_avx512vl(local_380,_local_3e0,1);
          auVar172._0_4_ = (float)local_400._0_4_ + (float)local_1c0._0_4_;
          auVar172._4_4_ = (float)local_400._4_4_ + (float)local_1c0._4_4_;
          auVar172._8_4_ = fStack_3f8 + fStack_1b8;
          auVar172._12_4_ = fStack_3f4 + fStack_1b4;
          auVar172._16_4_ = fStack_3f0 + fStack_1b0;
          auVar172._20_4_ = fStack_3ec + fStack_1ac;
          auVar172._24_4_ = fStack_3e8 + fStack_1a8;
          auVar172._28_4_ = fStack_3e4 + fStack_1a4;
          uVar159 = auVar220._0_4_;
          auVar194._4_4_ = uVar159;
          auVar194._0_4_ = uVar159;
          auVar194._8_4_ = uVar159;
          auVar194._12_4_ = uVar159;
          auVar194._16_4_ = uVar159;
          auVar194._20_4_ = uVar159;
          auVar194._24_4_ = uVar159;
          auVar194._28_4_ = uVar159;
          uVar12 = vcmpps_avx512vl(auVar172,auVar194,2);
          bVar64 = (byte)local_88c & (byte)uVar14 & (byte)uVar12;
          auVar206._0_4_ = (float)local_400._0_4_ + (float)local_360._0_4_;
          auVar206._4_4_ = (float)local_400._4_4_ + (float)local_360._4_4_;
          auVar206._8_4_ = fStack_3f8 + fStack_358;
          auVar206._12_4_ = fStack_3f4 + fStack_354;
          auVar206._16_4_ = fStack_3f0 + fStack_350;
          auVar206._20_4_ = fStack_3ec + fStack_34c;
          auVar206._24_4_ = fStack_3e8 + fStack_348;
          auVar206._28_4_ = fStack_3e4 + fStack_344;
          uVar12 = vcmpps_avx512vl(auVar206,auVar194,2);
          bVar58 = bVar58 & (byte)uVar13 & (byte)uVar12 | bVar64;
          if (bVar58 != 0) {
            abStack_180[uVar60 * 0x60] = bVar58;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            bVar3 = (bool)(bVar64 >> 2 & 1);
            bVar4 = (bool)(bVar64 >> 3 & 1);
            bVar5 = (bool)(bVar64 >> 4 & 1);
            bVar6 = (bool)(bVar64 >> 5 & 1);
            bVar7 = (bool)(bVar64 >> 6 & 1);
            auStack_160[uVar60 * 0x18] =
                 (uint)(bVar64 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar64 & 1) * local_360._0_4_;
            auStack_160[uVar60 * 0x18 + 1] =
                 (uint)bVar67 * local_1c0._4_4_ | (uint)!bVar67 * local_360._4_4_;
            auStack_160[uVar60 * 0x18 + 2] =
                 (uint)bVar3 * (int)fStack_1b8 | (uint)!bVar3 * (int)fStack_358;
            auStack_160[uVar60 * 0x18 + 3] =
                 (uint)bVar4 * (int)fStack_1b4 | (uint)!bVar4 * (int)fStack_354;
            auStack_160[uVar60 * 0x18 + 4] =
                 (uint)bVar5 * (int)fStack_1b0 | (uint)!bVar5 * (int)fStack_350;
            auStack_160[uVar60 * 0x18 + 5] =
                 (uint)bVar6 * (int)fStack_1ac | (uint)!bVar6 * (int)fStack_34c;
            auStack_160[uVar60 * 0x18 + 6] =
                 (uint)bVar7 * (int)fStack_1a8 | (uint)!bVar7 * (int)fStack_348;
            auStack_160[uVar60 * 0x18 + 7] =
                 (uint)(bVar64 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar64 >> 7) * (int)fStack_344;
            uVar68 = vmovlps_avx(local_390);
            (&uStack_140)[uVar60 * 0xc] = uVar68;
            aiStack_138[uVar60 * 0x18] = iVar65 + 1;
            uVar60 = (ulong)((int)uVar60 + 1);
          }
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar251 = ZEXT3264(auVar94);
          auVar220 = ZEXT3264(_DAT_01f7b040);
          pPVar63 = local_798;
          prim = local_790;
        }
      }
    }
    do {
      uVar69 = (uint)uVar60;
      uVar60 = (ulong)(uVar69 - 1);
      if (uVar69 == 0) {
        if (bVar66 != 0) goto LAB_019d8a66;
        uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar28._4_4_ = uVar159;
        auVar28._0_4_ = uVar159;
        auVar28._8_4_ = uVar159;
        auVar28._12_4_ = uVar159;
        auVar28._16_4_ = uVar159;
        auVar28._20_4_ = uVar159;
        auVar28._24_4_ = uVar159;
        auVar28._28_4_ = uVar159;
        uVar12 = vcmpps_avx512vl(local_300,auVar28,2);
        local_780 = (ulong)((uint)local_788 & (uint)uVar12);
        goto LAB_019d60fd;
      }
      auVar94 = *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x18);
      auVar173._0_4_ = auVar94._0_4_ + (float)local_400._0_4_;
      auVar173._4_4_ = auVar94._4_4_ + (float)local_400._4_4_;
      auVar173._8_4_ = auVar94._8_4_ + fStack_3f8;
      auVar173._12_4_ = auVar94._12_4_ + fStack_3f4;
      auVar173._16_4_ = auVar94._16_4_ + fStack_3f0;
      auVar173._20_4_ = auVar94._20_4_ + fStack_3ec;
      auVar173._24_4_ = auVar94._24_4_ + fStack_3e8;
      auVar173._28_4_ = auVar94._28_4_ + fStack_3e4;
      uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar27._4_4_ = uVar159;
      auVar27._0_4_ = uVar159;
      auVar27._8_4_ = uVar159;
      auVar27._12_4_ = uVar159;
      auVar27._16_4_ = uVar159;
      auVar27._20_4_ = uVar159;
      auVar27._24_4_ = uVar159;
      auVar27._28_4_ = uVar159;
      uVar12 = vcmpps_avx512vl(auVar173,auVar27,2);
      uVar130 = (uint)uVar12 & (uint)abStack_180[uVar60 * 0x60];
    } while (uVar130 == 0);
    uVar68 = (&uStack_140)[uVar60 * 0xc];
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar68;
    auVar195._8_4_ = 0x7f800000;
    auVar195._0_8_ = 0x7f8000007f800000;
    auVar195._12_4_ = 0x7f800000;
    auVar195._16_4_ = 0x7f800000;
    auVar195._20_4_ = 0x7f800000;
    auVar195._24_4_ = 0x7f800000;
    auVar195._28_4_ = 0x7f800000;
    auVar83 = vblendmps_avx512vl(auVar195,auVar94);
    bVar58 = (byte)uVar130;
    auVar129._0_4_ =
         (uint)(bVar58 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)auVar94._0_4_;
    bVar67 = (bool)((byte)(uVar130 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar67 * auVar83._4_4_ | (uint)!bVar67 * (int)auVar94._4_4_;
    bVar67 = (bool)((byte)(uVar130 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar67 * auVar83._8_4_ | (uint)!bVar67 * (int)auVar94._8_4_;
    bVar67 = (bool)((byte)(uVar130 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar67 * auVar83._12_4_ | (uint)!bVar67 * (int)auVar94._12_4_;
    bVar67 = (bool)((byte)(uVar130 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar67 * auVar83._16_4_ | (uint)!bVar67 * (int)auVar94._16_4_;
    bVar67 = (bool)((byte)(uVar130 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar67 * auVar83._20_4_ | (uint)!bVar67 * (int)auVar94._20_4_;
    bVar67 = (bool)((byte)(uVar130 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar67 * auVar83._24_4_ | (uint)!bVar67 * (int)auVar94._24_4_;
    auVar129._28_4_ =
         (uVar130 >> 7) * auVar83._28_4_ | (uint)!SUB41(uVar130 >> 7,0) * (int)auVar94._28_4_;
    auVar94 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar94 = vminps_avx(auVar129,auVar94);
    auVar83 = vshufpd_avx(auVar94,auVar94,5);
    auVar94 = vminps_avx(auVar94,auVar83);
    auVar83 = vpermpd_avx2(auVar94,0x4e);
    auVar94 = vminps_avx(auVar94,auVar83);
    uVar12 = vcmpps_avx512vl(auVar129,auVar94,0);
    bVar64 = (byte)uVar12 & bVar58;
    if (bVar64 != 0) {
      uVar130 = (uint)bVar64;
    }
    uVar131 = 0;
    for (; (uVar130 & 1) == 0; uVar130 = uVar130 >> 1 | 0x80000000) {
      uVar131 = uVar131 + 1;
    }
    iVar65 = aiStack_138[uVar60 * 0x18];
    bVar58 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar58;
    abStack_180[uVar60 * 0x60] = bVar58;
    if (bVar58 == 0) {
      uVar69 = uVar69 - 1;
    }
    uVar159 = (undefined4)uVar68;
    auVar152._4_4_ = uVar159;
    auVar152._0_4_ = uVar159;
    auVar152._8_4_ = uVar159;
    auVar152._12_4_ = uVar159;
    auVar152._16_4_ = uVar159;
    auVar152._20_4_ = uVar159;
    auVar152._24_4_ = uVar159;
    auVar152._28_4_ = uVar159;
    auVar72 = vmovshdup_avx(auVar170);
    auVar72 = vsubps_avx(auVar72,auVar170);
    auVar174._0_4_ = auVar72._0_4_;
    auVar174._4_4_ = auVar174._0_4_;
    auVar174._8_4_ = auVar174._0_4_;
    auVar174._12_4_ = auVar174._0_4_;
    auVar174._16_4_ = auVar174._0_4_;
    auVar174._20_4_ = auVar174._0_4_;
    auVar174._24_4_ = auVar174._0_4_;
    auVar174._28_4_ = auVar174._0_4_;
    auVar72 = vfmadd132ps_fma(auVar174,auVar152,auVar220._0_32_);
    _local_520 = ZEXT1632(auVar72);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_520 + (ulong)uVar131 * 4);
    uVar60 = (ulong)uVar69;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }